

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::sse2::CurveNiIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  int iVar44;
  undefined4 uVar45;
  ulong uVar46;
  long lVar47;
  undefined4 uVar50;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *pRVar48;
  undefined1 (*pauVar49) [16];
  int iVar51;
  ulong uVar52;
  int iVar53;
  ulong uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  short sVar59;
  float fVar60;
  uint uVar61;
  float fVar103;
  float fVar105;
  __m128 a_1;
  undefined2 uVar102;
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  uint uVar104;
  uint uVar106;
  uint uVar107;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar108;
  float fVar124;
  float fVar125;
  vfloat4 v;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  float fVar135;
  float fVar136;
  vfloat_impl<4> t;
  float fVar137;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar138;
  float fVar150;
  float fVar151;
  vfloat4 v_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  float fVar164;
  float fVar165;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar166;
  float fVar183;
  float fVar184;
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  float fVar185;
  float fVar196;
  float fVar197;
  vfloat4 a;
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar220;
  float fVar221;
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar222;
  float fVar233;
  float fVar234;
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar243;
  float fVar244;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar249 [16];
  float fVar253;
  undefined8 uVar254;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar255 [16];
  float fVar262;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar263;
  float fVar270;
  float fVar271;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar267 [16];
  undefined1 auVar269 [16];
  float fVar272;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloat<4> dOz;
  vfloat<4> Oz;
  vfloat<4> A;
  BBox<embree::vfloat_impl<4>_> tp1;
  vfloat<4> rl;
  vfloat<4> B;
  vfloat<4> dOdO;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  RTCFilterFunctionNArguments local_518;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined4 local_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  float fStack_450;
  float fStack_44c;
  undefined4 local_448;
  uint local_444;
  uint local_440;
  uint local_43c;
  uint local_438;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  Primitive *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 uVar101;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar266 [16];
  undefined1 auVar268 [16];
  
  PVar6 = prim[1];
  uVar52 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar52 * 0x19 + 6;
  fVar125 = *(float *)(pPVar5 + 0xc);
  fVar138 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar5) * fVar125;
  fVar150 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar125;
  fVar151 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar125;
  fVar108 = fVar125 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar124 = fVar125 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar125 = fVar125 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar50 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar101 = (undefined1)((uint)uVar50 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar50 >> 0x10);
  uVar254 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar50));
  uVar101 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar254 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar50,(char)uVar50);
  uVar54 = CONCAT62(uVar28,sVar59);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar54;
  auVar70._12_2_ = uVar102;
  auVar70._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar254 >> 0x20);
  auVar229._12_4_ = auVar70._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar54;
  auVar229._10_2_ = uVar102;
  auVar237._10_6_ = auVar229._10_6_;
  auVar237._8_2_ = uVar102;
  auVar237._0_8_ = uVar54;
  uVar102 = (undefined2)uVar28;
  auVar29._4_8_ = auVar237._8_8_;
  auVar29._2_2_ = uVar102;
  auVar29._0_2_ = uVar102;
  fVar126 = (float)((int)sVar59 >> 8);
  fVar135 = (float)(auVar29._0_4_ >> 0x18);
  fVar136 = (float)(auVar237._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar101 = (undefined1)((uint)uVar50 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar50 >> 0x10);
  uVar254 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar50));
  uVar101 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar254 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar50,(char)uVar50);
  uVar54 = CONCAT62(uVar28,sVar59);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar54;
  auVar63._12_2_ = uVar102;
  auVar63._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar254 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar54;
  auVar62._10_2_ = uVar102;
  auVar280._10_6_ = auVar62._10_6_;
  auVar280._8_2_ = uVar102;
  auVar280._0_8_ = uVar54;
  uVar102 = (undefined2)uVar28;
  auVar30._4_8_ = auVar280._8_8_;
  auVar30._2_2_ = uVar102;
  auVar30._0_2_ = uVar102;
  fVar152 = (float)((int)sVar59 >> 8);
  fVar164 = (float)(auVar30._0_4_ >> 0x18);
  fVar165 = (float)(auVar280._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar101 = (undefined1)((uint)uVar50 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar50 >> 0x10);
  uVar254 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar50));
  uVar101 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar254 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar50,(char)uVar50);
  uVar54 = CONCAT62(uVar28,sVar59);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar54;
  auVar66._12_2_ = uVar102;
  auVar66._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar254 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar54;
  auVar65._10_2_ = uVar102;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar102;
  auVar64._0_8_ = uVar54;
  uVar102 = (undefined2)uVar28;
  auVar31._4_8_ = auVar64._8_8_;
  auVar31._2_2_ = uVar102;
  auVar31._0_2_ = uVar102;
  fVar166 = (float)((int)sVar59 >> 8);
  fVar183 = (float)(auVar31._0_4_ >> 0x18);
  fVar184 = (float)(auVar64._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar52 * 0xb + 6);
  uVar101 = (undefined1)((uint)uVar50 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar50 >> 0x10);
  uVar254 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar50));
  uVar101 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar254 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar50,(char)uVar50);
  uVar54 = CONCAT62(uVar28,sVar59);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar54;
  auVar69._12_2_ = uVar102;
  auVar69._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar254 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar54;
  auVar68._10_2_ = uVar102;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar102;
  auVar67._0_8_ = uVar54;
  uVar102 = (undefined2)uVar28;
  auVar32._4_8_ = auVar67._8_8_;
  auVar32._2_2_ = uVar102;
  auVar32._0_2_ = uVar102;
  fVar60 = (float)((int)sVar59 >> 8);
  fVar103 = (float)(auVar32._0_4_ >> 0x18);
  fVar105 = (float)(auVar67._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar101 = (undefined1)((uint)uVar50 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar50 >> 0x10);
  uVar254 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar50));
  uVar101 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar254 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar50,(char)uVar50);
  uVar54 = CONCAT62(uVar28,sVar59);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar54;
  auVar188._12_2_ = uVar102;
  auVar188._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar254 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar54;
  auVar187._10_2_ = uVar102;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar102;
  auVar186._0_8_ = uVar54;
  uVar102 = (undefined2)uVar28;
  auVar33._4_8_ = auVar186._8_8_;
  auVar33._2_2_ = uVar102;
  auVar33._0_2_ = uVar102;
  fVar185 = (float)((int)sVar59 >> 8);
  fVar196 = (float)(auVar33._0_4_ >> 0x18);
  fVar197 = (float)(auVar186._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar52 + 6);
  uVar101 = (undefined1)((uint)uVar50 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar50 >> 0x10);
  uVar254 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar50));
  uVar101 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar254 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar50,(char)uVar50);
  uVar54 = CONCAT62(uVar28,sVar59);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar54;
  auVar201._12_2_ = uVar102;
  auVar201._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar254 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar54;
  auVar200._10_2_ = uVar102;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar102;
  auVar199._0_8_ = uVar54;
  uVar102 = (undefined2)uVar28;
  auVar34._4_8_ = auVar199._8_8_;
  auVar34._2_2_ = uVar102;
  auVar34._0_2_ = uVar102;
  fVar235 = (float)((int)sVar59 >> 8);
  fVar243 = (float)(auVar34._0_4_ >> 0x18);
  fVar244 = (float)(auVar199._8_4_ >> 0x18);
  uVar46 = (ulong)(uint)((int)(uVar52 * 9) * 2);
  uVar50 = *(undefined4 *)(prim + uVar46 + 6);
  uVar101 = (undefined1)((uint)uVar50 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar50 >> 0x10);
  uVar254 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar50));
  uVar101 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar254 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar50,(char)uVar50);
  uVar54 = CONCAT62(uVar28,sVar59);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar54;
  auVar204._12_2_ = uVar102;
  auVar204._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar254 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar54;
  auVar203._10_2_ = uVar102;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar102;
  auVar202._0_8_ = uVar54;
  uVar102 = (undefined2)uVar28;
  auVar35._4_8_ = auVar202._8_8_;
  auVar35._2_2_ = uVar102;
  auVar35._0_2_ = uVar102;
  fVar222 = (float)((int)sVar59 >> 8);
  fVar233 = (float)(auVar35._0_4_ >> 0x18);
  fVar234 = (float)(auVar202._8_4_ >> 0x18);
  uVar50 = *(undefined4 *)(prim + uVar46 + uVar52 + 6);
  uVar101 = (undefined1)((uint)uVar50 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar50 >> 0x10);
  uVar254 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar50));
  uVar101 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar254 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar50,(char)uVar50);
  uVar54 = CONCAT62(uVar28,sVar59);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar54;
  auVar207._12_2_ = uVar102;
  auVar207._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar254 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar54;
  auVar206._10_2_ = uVar102;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar102;
  auVar205._0_8_ = uVar54;
  uVar102 = (undefined2)uVar28;
  auVar36._4_8_ = auVar205._8_8_;
  auVar36._2_2_ = uVar102;
  auVar36._0_2_ = uVar102;
  fVar245 = (float)((int)sVar59 >> 8);
  fVar246 = (float)(auVar36._0_4_ >> 0x18);
  fVar247 = (float)(auVar205._8_4_ >> 0x18);
  uVar46 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  uVar50 = *(undefined4 *)(prim + uVar46 + 6);
  uVar101 = (undefined1)((uint)uVar50 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar50 >> 0x10);
  uVar254 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar50));
  uVar101 = (undefined1)((uint)uVar50 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar254 >> 0x20),uVar101),uVar101);
  sVar59 = CONCAT11((char)uVar50,(char)uVar50);
  uVar54 = CONCAT62(uVar28,sVar59);
  auVar210._8_4_ = 0;
  auVar210._0_8_ = uVar54;
  auVar210._12_2_ = uVar102;
  auVar210._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar254 >> 0x20);
  auVar209._12_4_ = auVar210._12_4_;
  auVar209._8_2_ = 0;
  auVar209._0_8_ = uVar54;
  auVar209._10_2_ = uVar102;
  auVar208._10_6_ = auVar209._10_6_;
  auVar208._8_2_ = uVar102;
  auVar208._0_8_ = uVar54;
  uVar102 = (undefined2)uVar28;
  auVar37._4_8_ = auVar208._8_8_;
  auVar37._2_2_ = uVar102;
  auVar37._0_2_ = uVar102;
  fVar263 = (float)((int)sVar59 >> 8);
  fVar270 = (float)(auVar37._0_4_ >> 0x18);
  fVar271 = (float)(auVar208._8_4_ >> 0x18);
  fVar253 = fVar108 * fVar126 + fVar124 * fVar152 + fVar125 * fVar166;
  fVar259 = fVar108 * fVar135 + fVar124 * fVar164 + fVar125 * fVar183;
  fVar260 = fVar108 * fVar136 + fVar124 * fVar165 + fVar125 * fVar184;
  fVar261 = fVar108 * (float)(auVar229._12_4_ >> 0x18) +
            fVar124 * (float)(auVar62._12_4_ >> 0x18) + fVar125 * (float)(auVar65._12_4_ >> 0x18);
  fVar248 = fVar108 * fVar60 + fVar124 * fVar185 + fVar125 * fVar235;
  fVar250 = fVar108 * fVar103 + fVar124 * fVar196 + fVar125 * fVar243;
  fVar251 = fVar108 * fVar105 + fVar124 * fVar197 + fVar125 * fVar244;
  fVar252 = fVar108 * (float)(auVar68._12_4_ >> 0x18) +
            fVar124 * (float)(auVar187._12_4_ >> 0x18) + fVar125 * (float)(auVar200._12_4_ >> 0x18);
  fVar198 = fVar108 * fVar222 + fVar124 * fVar245 + fVar125 * fVar263;
  fVar220 = fVar108 * fVar233 + fVar124 * fVar246 + fVar125 * fVar270;
  fVar221 = fVar108 * fVar234 + fVar124 * fVar247 + fVar125 * fVar271;
  fVar125 = fVar108 * (float)(auVar203._12_4_ >> 0x18) +
            fVar124 * (float)(auVar206._12_4_ >> 0x18) + fVar125 * (float)(auVar209._12_4_ >> 0x18);
  fVar127 = fVar126 * fVar138 + fVar152 * fVar150 + fVar166 * fVar151;
  fVar183 = fVar135 * fVar138 + fVar164 * fVar150 + fVar183 * fVar151;
  fVar184 = fVar136 * fVar138 + fVar165 * fVar150 + fVar184 * fVar151;
  fVar137 = (float)(auVar229._12_4_ >> 0x18) * fVar138 +
            (float)(auVar62._12_4_ >> 0x18) * fVar150 + (float)(auVar65._12_4_ >> 0x18) * fVar151;
  fVar185 = fVar60 * fVar138 + fVar185 * fVar150 + fVar235 * fVar151;
  fVar196 = fVar103 * fVar138 + fVar196 * fVar150 + fVar243 * fVar151;
  fVar197 = fVar105 * fVar138 + fVar197 * fVar150 + fVar244 * fVar151;
  fVar235 = (float)(auVar68._12_4_ >> 0x18) * fVar138 +
            (float)(auVar187._12_4_ >> 0x18) * fVar150 + (float)(auVar200._12_4_ >> 0x18) * fVar151;
  fVar152 = fVar138 * fVar222 + fVar150 * fVar245 + fVar151 * fVar263;
  fVar164 = fVar138 * fVar233 + fVar150 * fVar246 + fVar151 * fVar270;
  fVar165 = fVar138 * fVar234 + fVar150 * fVar247 + fVar151 * fVar271;
  fVar166 = fVar138 * (float)(auVar203._12_4_ >> 0x18) +
            fVar150 * (float)(auVar206._12_4_ >> 0x18) + fVar151 * (float)(auVar209._12_4_ >> 0x18);
  uVar61 = (uint)DAT_01f7b6c0;
  uVar104 = DAT_01f7b6c0._4_4_;
  uVar106 = DAT_01f7b6c0._8_4_;
  uVar107 = DAT_01f7b6c0._12_4_;
  uVar55 = -(uint)(1e-18 <= (float)((uint)fVar253 & uVar61));
  uVar56 = -(uint)(1e-18 <= (float)((uint)fVar259 & uVar104));
  uVar57 = -(uint)(1e-18 <= (float)((uint)fVar260 & uVar106));
  uVar58 = -(uint)(1e-18 <= (float)((uint)fVar261 & uVar107));
  auVar255._0_4_ = (uint)fVar253 & uVar55;
  auVar255._4_4_ = (uint)fVar259 & uVar56;
  auVar255._8_4_ = (uint)fVar260 & uVar57;
  auVar255._12_4_ = (uint)fVar261 & uVar58;
  auVar139._0_8_ = CONCAT44(~uVar56,~uVar55) & 0x219392ef219392ef;
  auVar139._8_4_ = ~uVar57 & 0x219392ef;
  auVar139._12_4_ = ~uVar58 & 0x219392ef;
  auVar139 = auVar139 | auVar255;
  uVar55 = -(uint)(1e-18 <= (float)((uint)fVar248 & uVar61));
  uVar56 = -(uint)(1e-18 <= (float)((uint)fVar250 & uVar104));
  uVar57 = -(uint)(1e-18 <= (float)((uint)fVar251 & uVar106));
  uVar58 = -(uint)(1e-18 <= (float)((uint)fVar252 & uVar107));
  auVar249._0_4_ = (uint)fVar248 & uVar55;
  auVar249._4_4_ = (uint)fVar250 & uVar56;
  auVar249._8_4_ = (uint)fVar251 & uVar57;
  auVar249._12_4_ = (uint)fVar252 & uVar58;
  auVar153._0_8_ = CONCAT44(~uVar56,~uVar55) & 0x219392ef219392ef;
  auVar153._8_4_ = ~uVar57 & 0x219392ef;
  auVar153._12_4_ = ~uVar58 & 0x219392ef;
  auVar153 = auVar153 | auVar249;
  uVar55 = -(uint)(1e-18 <= (float)((uint)fVar198 & uVar61));
  uVar56 = -(uint)(1e-18 <= (float)((uint)fVar220 & uVar104));
  uVar57 = -(uint)(1e-18 <= (float)((uint)fVar221 & uVar106));
  uVar58 = -(uint)(1e-18 <= (float)((uint)fVar125 & uVar107));
  auVar211._0_4_ = (uint)fVar198 & uVar55;
  auVar211._4_4_ = (uint)fVar220 & uVar56;
  auVar211._8_4_ = (uint)fVar221 & uVar57;
  auVar211._12_4_ = (uint)fVar125 & uVar58;
  auVar189._0_8_ = CONCAT44(~uVar56,~uVar55) & 0x219392ef219392ef;
  auVar189._8_4_ = ~uVar57 & 0x219392ef;
  auVar189._12_4_ = ~uVar58 & 0x219392ef;
  auVar189 = auVar189 | auVar211;
  auVar70 = rcpps(_DAT_01f7b6c0,auVar139);
  fVar125 = auVar70._0_4_;
  fVar105 = auVar70._4_4_;
  fVar126 = auVar70._8_4_;
  fVar138 = auVar70._12_4_;
  fVar125 = (1.0 - auVar139._0_4_ * fVar125) * fVar125 + fVar125;
  fVar105 = (1.0 - auVar139._4_4_ * fVar105) * fVar105 + fVar105;
  fVar126 = (1.0 - auVar139._8_4_ * fVar126) * fVar126 + fVar126;
  fVar138 = (1.0 - auVar139._12_4_ * fVar138) * fVar138 + fVar138;
  auVar70 = rcpps(auVar70,auVar153);
  fVar60 = auVar70._0_4_;
  fVar108 = auVar70._4_4_;
  fVar135 = auVar70._8_4_;
  fVar150 = auVar70._12_4_;
  fVar60 = (1.0 - auVar153._0_4_ * fVar60) * fVar60 + fVar60;
  fVar108 = (1.0 - auVar153._4_4_ * fVar108) * fVar108 + fVar108;
  fVar135 = (1.0 - auVar153._8_4_ * fVar135) * fVar135 + fVar135;
  fVar150 = (1.0 - auVar153._12_4_ * fVar150) * fVar150 + fVar150;
  auVar70 = rcpps(auVar70,auVar189);
  fVar103 = auVar70._0_4_;
  fVar124 = auVar70._4_4_;
  fVar136 = auVar70._8_4_;
  fVar151 = auVar70._12_4_;
  fVar103 = (1.0 - auVar189._0_4_ * fVar103) * fVar103 + fVar103;
  fVar124 = (1.0 - auVar189._4_4_ * fVar124) * fVar124 + fVar124;
  fVar136 = (1.0 - auVar189._8_4_ * fVar136) * fVar136 + fVar136;
  fVar151 = (1.0 - auVar189._12_4_ * fVar151) * fVar151 + fVar151;
  uVar54 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar102 = (undefined2)(uVar54 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar54;
  auVar73._12_2_ = uVar102;
  auVar73._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar54 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar54;
  auVar72._10_2_ = uVar102;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar102;
  auVar71._0_8_ = uVar54;
  uVar102 = (undefined2)(uVar54 >> 0x10);
  auVar38._4_8_ = auVar71._8_8_;
  auVar38._2_2_ = uVar102;
  auVar38._0_2_ = uVar102;
  auVar140._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar183) * fVar105,
                ((float)(int)(short)uVar54 - fVar127) * fVar125);
  auVar140._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar184) * fVar126;
  auVar140._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar137) * fVar138;
  uVar54 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar102 = (undefined2)(uVar54 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar54;
  auVar76._12_2_ = uVar102;
  auVar76._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar54 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar54;
  auVar75._10_2_ = uVar102;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar102;
  auVar74._0_8_ = uVar54;
  uVar102 = (undefined2)(uVar54 >> 0x10);
  auVar39._4_8_ = auVar74._8_8_;
  auVar39._2_2_ = uVar102;
  auVar39._0_2_ = uVar102;
  auVar190._0_4_ = ((float)(int)(short)uVar54 - fVar127) * fVar125;
  auVar190._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar183) * fVar105;
  auVar190._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar184) * fVar126;
  auVar190._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar137) * fVar138;
  lVar47 = uVar46 + uVar52;
  uVar54 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar46 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar52 * -2 + 6);
  uVar102 = (undefined2)(uVar46 >> 0x30);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar46;
  auVar214._12_2_ = uVar102;
  auVar214._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar46 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar46;
  auVar213._10_2_ = uVar102;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar102;
  auVar212._0_8_ = uVar46;
  uVar102 = (undefined2)(uVar46 >> 0x10);
  auVar40._4_8_ = auVar212._8_8_;
  auVar40._2_2_ = uVar102;
  auVar40._0_2_ = uVar102;
  auVar215._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar196) * fVar108,
                ((float)(int)(short)uVar46 - fVar185) * fVar60);
  auVar215._8_4_ = ((float)(auVar212._8_4_ >> 0x10) - fVar197) * fVar135;
  auVar215._12_4_ = ((float)(auVar213._12_4_ >> 0x10) - fVar235) * fVar150;
  uVar102 = (undefined2)(uVar54 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar54;
  auVar79._12_2_ = uVar102;
  auVar79._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar54 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar54;
  auVar78._10_2_ = uVar102;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar102;
  auVar77._0_8_ = uVar54;
  uVar102 = (undefined2)(uVar54 >> 0x10);
  auVar41._4_8_ = auVar77._8_8_;
  auVar41._2_2_ = uVar102;
  auVar41._0_2_ = uVar102;
  auVar80._0_4_ = ((float)(int)(short)uVar54 - fVar185) * fVar60;
  auVar80._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar196) * fVar108;
  auVar80._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar197) * fVar135;
  auVar80._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar235) * fVar150;
  uVar54 = *(ulong *)(prim + lVar47 + 6);
  uVar102 = (undefined2)(uVar54 >> 0x30);
  auVar169._8_4_ = 0;
  auVar169._0_8_ = uVar54;
  auVar169._12_2_ = uVar102;
  auVar169._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar54 >> 0x20);
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._8_2_ = 0;
  auVar168._0_8_ = uVar54;
  auVar168._10_2_ = uVar102;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._8_2_ = uVar102;
  auVar167._0_8_ = uVar54;
  uVar102 = (undefined2)(uVar54 >> 0x10);
  auVar42._4_8_ = auVar167._8_8_;
  auVar42._2_2_ = uVar102;
  auVar42._0_2_ = uVar102;
  auVar170._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar164) * fVar124,
                ((float)(int)(short)uVar54 - fVar152) * fVar103);
  auVar170._8_4_ = ((float)(auVar167._8_4_ >> 0x10) - fVar165) * fVar136;
  auVar170._12_4_ = ((float)(auVar168._12_4_ >> 0x10) - fVar166) * fVar151;
  uVar54 = *(ulong *)(prim + uVar52 * 0x17 + 6);
  uVar102 = (undefined2)(uVar54 >> 0x30);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar54;
  auVar225._12_2_ = uVar102;
  auVar225._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar54 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar54;
  auVar224._10_2_ = uVar102;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar102;
  auVar223._0_8_ = uVar54;
  uVar102 = (undefined2)(uVar54 >> 0x10);
  auVar43._4_8_ = auVar223._8_8_;
  auVar43._2_2_ = uVar102;
  auVar43._0_2_ = uVar102;
  auVar226._0_4_ = ((float)(int)(short)uVar54 - fVar152) * fVar103;
  auVar226._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar164) * fVar124;
  auVar226._8_4_ = ((float)(auVar223._8_4_ >> 0x10) - fVar165) * fVar136;
  auVar226._12_4_ = ((float)(auVar224._12_4_ >> 0x10) - fVar166) * fVar151;
  auVar236._8_4_ = auVar140._8_4_;
  auVar236._0_8_ = auVar140._0_8_;
  auVar236._12_4_ = auVar140._12_4_;
  auVar237 = minps(auVar236,auVar190);
  auVar109._8_4_ = auVar215._8_4_;
  auVar109._0_8_ = auVar215._0_8_;
  auVar109._12_4_ = auVar215._12_4_;
  auVar70 = minps(auVar109,auVar80);
  auVar237 = maxps(auVar237,auVar70);
  auVar110._8_4_ = auVar170._8_4_;
  auVar110._0_8_ = auVar170._0_8_;
  auVar110._12_4_ = auVar170._12_4_;
  auVar70 = minps(auVar110,auVar226);
  uVar50 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar154._4_4_ = uVar50;
  auVar154._0_4_ = uVar50;
  auVar154._8_4_ = uVar50;
  auVar154._12_4_ = uVar50;
  auVar70 = maxps(auVar70,auVar154);
  auVar70 = maxps(auVar237,auVar70);
  local_1c8 = auVar70._0_4_ * 0.99999964;
  fStack_1c4 = auVar70._4_4_ * 0.99999964;
  fStack_1c0 = auVar70._8_4_ * 0.99999964;
  fStack_1bc = auVar70._12_4_ * 0.99999964;
  auVar70 = maxps(auVar140,auVar190);
  auVar237 = maxps(auVar215,auVar80);
  auVar70 = minps(auVar70,auVar237);
  auVar237 = maxps(auVar170,auVar226);
  fVar125 = (ray->super_RayK<1>).tfar;
  auVar81._4_4_ = fVar125;
  auVar81._0_4_ = fVar125;
  auVar81._8_4_ = fVar125;
  auVar81._12_4_ = fVar125;
  auVar237 = minps(auVar237,auVar81);
  auVar70 = minps(auVar70,auVar237);
  auVar111._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_1c8 <= auVar70._0_4_ * 1.0000004);
  auVar111._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_1c4 <= auVar70._4_4_ * 1.0000004);
  auVar111._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_1c0 <= auVar70._8_4_ * 1.0000004);
  auVar111._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_1bc <= auVar70._12_4_ * 1.0000004);
  uVar55 = movmskps((int)lVar47,auVar111);
  if (uVar55 == 0) {
    return;
  }
  uVar55 = uVar55 & 0xff;
  local_198._0_12_ = mm_lookupmask_ps._240_12_;
  local_198._12_4_ = 0;
  local_2c0 = prim;
LAB_00a771fe:
  uVar54 = (ulong)uVar55;
  lVar47 = 0;
  if (uVar54 != 0) {
    for (; (uVar55 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
    }
  }
  uVar54 = uVar54 - 1 & uVar54;
  uVar55 = *(uint *)(local_2c0 + 2);
  uVar56 = *(uint *)(local_2c0 + lVar47 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar55].ptr;
  uVar46 = *(ulong *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar52 = (ulong)*(uint *)(uVar46 + _Var8 * uVar56);
  p_Var9 = pGVar7[1].intersectionFilterN;
  lVar47 = 0;
  if (uVar54 != 0) {
    for (; (uVar54 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
    }
  }
  lVar47 = *(long *)&pGVar7[1].time_range.upper;
  pfVar1 = (float *)(lVar47 + (long)p_Var9 * uVar52);
  pfVar2 = (float *)(lVar47 + (uVar52 + 1) * (long)p_Var9);
  pfVar3 = (float *)(lVar47 + (uVar52 + 2) * (long)p_Var9);
  pfVar4 = (float *)(lVar47 + (uVar52 + 3) * (long)p_Var9);
  if ((uVar54 != 0) && (uVar52 = uVar54 - 1 & uVar54, uVar52 != 0)) {
    lVar47 = 0;
    if (uVar52 != 0) {
      for (; (uVar52 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
      }
    }
    uVar46 = (ulong)*(uint *)(uVar46 + _Var8 * *(uint *)(local_2c0 + lVar47 * 4 + 6));
  }
  local_358 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar125 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar60 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_368 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_418 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_4e8 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar103 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_13c = local_368 * local_368;
  fVar108 = local_418 * local_418;
  fVar124 = local_4e8 * local_4e8;
  fVar103 = fVar103 * fVar103;
  fVar105 = fStack_13c + fVar108 + fVar124;
  auVar155._0_8_ = CONCAT44(fVar108 + fVar108 + fVar103,fVar105);
  auVar155._8_4_ = fVar124 + fVar108 + fVar124;
  auVar155._12_4_ = fVar103 + fVar108 + fVar103;
  auVar141._8_4_ = auVar155._8_4_;
  auVar141._0_8_ = auVar155._0_8_;
  auVar141._12_4_ = auVar155._12_4_;
  auVar70 = rcpss(auVar141,auVar155);
  local_468 = (2.0 - fVar105 * auVar70._0_4_) * auVar70._0_4_ *
              (((pfVar1[2] + pfVar2[2]) * 0.5 - fVar60) * local_4e8 +
              ((pfVar1[1] + pfVar2[1]) * 0.5 - fVar125) * local_418 +
              ((*pfVar1 + *pfVar2) * 0.5 - local_358) * local_368);
  local_2e8 = ZEXT416((uint)local_468);
  local_358 = local_368 * local_468 + local_358;
  fVar125 = local_418 * local_468 + fVar125;
  fVar60 = local_4e8 * local_468 + fVar60;
  local_328 = *pfVar1 - local_358;
  local_158 = pfVar1[1] - fVar125;
  local_168 = pfVar1[2] - fVar60;
  fStack_31c = pfVar1[3] - 0.0;
  fVar103 = *pfVar3 - local_358;
  fVar105 = pfVar3[1] - fVar125;
  local_258 = pfVar3[2] - fVar60;
  fStack_33c = pfVar3[3] - 0.0;
  local_218 = *pfVar2 - local_358;
  local_228 = pfVar2[1] - fVar125;
  local_238 = pfVar2[2] - fVar60;
  fStack_32c = pfVar2[3] - 0.0;
  local_358 = *pfVar4 - local_358;
  fVar125 = pfVar4[1] - fVar125;
  fVar60 = pfVar4[2] - fVar60;
  fStack_34c = pfVar4[3] - 0.0;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  fStack_324 = local_158;
  fStack_320 = local_168;
  local_208 = fStack_31c;
  fStack_204 = fStack_31c;
  fStack_200 = fStack_31c;
  fStack_1fc = fStack_31c;
  fStack_214 = local_218;
  fStack_210 = local_218;
  fStack_20c = local_218;
  fStack_224 = local_228;
  fStack_220 = local_228;
  fStack_21c = local_228;
  fStack_234 = local_238;
  fStack_230 = local_238;
  fStack_22c = local_238;
  local_338 = local_218;
  fStack_334 = local_228;
  fStack_330 = local_238;
  local_248 = fStack_32c;
  fStack_244 = fStack_32c;
  fStack_240 = fStack_32c;
  fStack_23c = fStack_32c;
  fStack_254 = local_258;
  fStack_250 = local_258;
  fStack_24c = local_258;
  local_148 = fStack_13c + fVar124 + fVar108;
  fStack_144 = fStack_13c + fVar124 + fVar108;
  fStack_140 = fStack_13c + fVar124 + fVar108;
  fStack_13c = fStack_13c + fVar124 + fVar108;
  local_348 = fVar103;
  fStack_344 = fVar105;
  fStack_340 = local_258;
  local_268 = fStack_33c;
  fStack_264 = fStack_33c;
  fStack_260 = fStack_33c;
  fStack_25c = fStack_33c;
  fStack_354 = fVar125;
  fStack_350 = fVar60;
  local_278 = fStack_34c;
  fStack_274 = fStack_34c;
  fStack_270 = fStack_34c;
  fStack_26c = fStack_34c;
  fStack_364 = local_368;
  fStack_360 = local_368;
  fStack_35c = local_368;
  fStack_414 = local_418;
  fStack_410 = local_418;
  fStack_40c = local_418;
  local_298 = ABS(local_148);
  fStack_294 = ABS(fStack_144);
  fStack_290 = ABS(fStack_140);
  fStack_28c = ABS(fStack_13c);
  iVar51 = 1;
  uVar52 = 0;
  local_188 = 0.0;
  fStack_184 = 1.0;
  local_1f8 = local_328;
  fStack_1f4 = local_328;
  fStack_1f0 = local_328;
  fStack_1ec = local_328;
  local_288 = local_358;
  fStack_284 = local_358;
  fStack_280 = local_358;
  fStack_27c = local_358;
  fStack_4e4 = local_4e8;
  fStack_4e0 = local_4e8;
  fStack_4dc = local_4e8;
  fStack_464 = local_468;
  fStack_460 = local_468;
  fStack_45c = local_468;
  do {
    iVar53 = (int)uVar52;
    local_3e8 = fStack_184 - local_188;
    uStack_180 = 0;
    uStack_17c = 0;
    fStack_3e4 = local_3e8;
    fStack_3e0 = local_3e8;
    fStack_3dc = local_3e8;
    local_408 = local_188;
    fStack_404 = local_188;
    fStack_400 = local_188;
    fStack_3fc = local_188;
    fVar183 = local_3e8 * 0.0 + local_188;
    fVar137 = local_3e8 * 0.33333334 + local_188;
    fVar196 = local_3e8 * 0.6666667 + local_188;
    fVar198 = local_3e8 * 1.0 + local_188;
    fVar221 = 1.0 - fVar183;
    fVar234 = 1.0 - fVar137;
    fVar244 = 1.0 - fVar196;
    fVar247 = 1.0 - fVar198;
    fVar108 = fVar183 * 3.0;
    fVar126 = fVar137 * 3.0;
    fVar136 = fVar196 * 3.0;
    fVar150 = fVar198 * 3.0;
    fVar222 = ((fVar221 * 3.0 + -5.0) * fVar221 * fVar221 + 2.0) * 0.5;
    fVar233 = ((fVar234 * 3.0 + -5.0) * fVar234 * fVar234 + 2.0) * 0.5;
    fVar235 = ((fVar244 * 3.0 + -5.0) * fVar244 * fVar244 + 2.0) * 0.5;
    fVar243 = ((fVar247 * 3.0 + -5.0) * fVar247 * fVar247 + 2.0) * 0.5;
    fVar184 = -fVar221 * fVar183 * fVar183 * 0.5;
    fVar185 = -fVar234 * fVar137 * fVar137 * 0.5;
    fVar197 = -fVar244 * fVar196 * fVar196 * 0.5;
    fVar220 = -fVar247 * fVar198 * fVar198 * 0.5;
    fVar245 = (fVar183 * fVar183 * (fVar108 + -5.0) + 2.0) * 0.5;
    fVar246 = (fVar137 * fVar137 * (fVar126 + -5.0) + 2.0) * 0.5;
    fVar248 = (fVar196 * fVar196 * (fVar136 + -5.0) + 2.0) * 0.5;
    fVar250 = (fVar198 * fVar198 * (fVar150 + -5.0) + 2.0) * 0.5;
    fVar152 = local_3e8 * 0.11111111;
    fVar251 = -fVar183 * fVar221 * fVar221 * 0.5;
    fVar252 = -fVar137 * fVar234 * fVar234 * 0.5;
    fVar253 = -fVar196 * fVar244 * fVar244 * 0.5;
    fVar259 = -fVar198 * fVar247 * fVar247 * 0.5;
    fVar278 = local_1f8 * fVar251 + local_218 * fVar245 + fVar103 * fVar222 + local_288 * fVar184;
    fVar281 = fStack_1f4 * fVar252 + fStack_214 * fVar246 + fVar103 * fVar233 + fStack_284 * fVar185
    ;
    fVar282 = fStack_1f0 * fVar253 + fStack_210 * fVar248 + fVar103 * fVar235 + fStack_280 * fVar197
    ;
    fVar283 = fStack_1ec * fVar259 + fStack_20c * fVar250 + fVar103 * fVar243 + fStack_27c * fVar220
    ;
    fVar164 = local_158 * fVar251 + local_228 * fVar245 + fVar105 * fVar222 + fVar125 * fVar184;
    fVar165 = fStack_154 * fVar252 + fStack_224 * fVar246 + fVar105 * fVar233 + fVar125 * fVar185;
    fVar166 = fStack_150 * fVar253 + fStack_220 * fVar248 + fVar105 * fVar235 + fVar125 * fVar197;
    fVar127 = fStack_14c * fVar259 + fStack_21c * fVar250 + fVar105 * fVar243 + fVar125 * fVar220;
    fVar124 = local_168 * fVar251 + local_238 * fVar245 + local_258 * fVar222 + fVar60 * fVar184;
    fVar135 = fStack_164 * fVar252 + fStack_234 * fVar246 + fStack_254 * fVar233 + fVar60 * fVar185;
    fVar138 = fStack_160 * fVar253 + fStack_230 * fVar248 + fStack_250 * fVar235 + fVar60 * fVar197;
    fVar151 = fStack_15c * fVar259 + fStack_22c * fVar250 + fStack_24c * fVar243 + fVar60 * fVar220;
    fVar251 = fVar251 * local_208 + fVar245 * local_248 + fVar222 * local_268 + fVar184 * local_278;
    fVar252 = fVar252 * fStack_204 +
              fVar246 * fStack_244 + fVar233 * fStack_264 + fVar185 * fStack_274;
    uVar254 = CONCAT44(fVar252,fVar251);
    fVar271 = fVar253 * fStack_200 +
              fVar248 * fStack_240 + fVar235 * fStack_260 + fVar197 * fStack_270;
    fVar262 = fVar259 * fStack_1fc +
              fVar250 * fStack_23c + fVar243 * fStack_25c + fVar220 * fStack_26c;
    fVar222 = fVar183 * (fVar221 + fVar221);
    fVar235 = fVar137 * (fVar234 + fVar234);
    fVar245 = fVar196 * (fVar244 + fVar244);
    fVar248 = fVar198 * (fVar247 + fVar247);
    fVar233 = (fVar222 - fVar221 * fVar221) * 0.5;
    fVar243 = (fVar235 - fVar234 * fVar234) * 0.5;
    fVar246 = (fVar245 - fVar244 * fVar244) * 0.5;
    fVar250 = (fVar248 - fVar247 * fVar247) * 0.5;
    fVar184 = (fVar183 * fVar108 + (fVar183 + fVar183) * (fVar108 + -5.0)) * 0.5;
    fVar185 = (fVar137 * fVar126 + (fVar137 + fVar137) * (fVar126 + -5.0)) * 0.5;
    fVar197 = (fVar196 * fVar136 + (fVar196 + fVar196) * (fVar136 + -5.0)) * 0.5;
    fVar220 = (fVar198 * fVar150 + (fVar198 + fVar198) * (fVar150 + -5.0)) * 0.5;
    fVar108 = ((fVar108 + 2.0) * (fVar221 + fVar221) - fVar221 * 3.0 * fVar221) * 0.5;
    fVar126 = ((fVar126 + 2.0) * (fVar234 + fVar234) - fVar234 * 3.0 * fVar234) * 0.5;
    fVar136 = ((fVar136 + 2.0) * (fVar244 + fVar244) - fVar244 * 3.0 * fVar244) * 0.5;
    fVar150 = ((fVar150 + 2.0) * (fVar247 + fVar247) - fVar247 * 3.0 * fVar247) * 0.5;
    fVar183 = (fVar183 * fVar183 - fVar222) * 0.5;
    fVar137 = (fVar137 * fVar137 - fVar235) * 0.5;
    fVar196 = (fVar196 * fVar196 - fVar245) * 0.5;
    fVar198 = (fVar198 * fVar198 - fVar248) * 0.5;
    local_3b8 = (local_1f8 * fVar233 + local_218 * fVar184 + fVar103 * fVar108 + local_288 * fVar183
                ) * fVar152;
    fStack_3b4 = (fStack_1f4 * fVar243 +
                 fStack_214 * fVar185 + fVar103 * fVar126 + fStack_284 * fVar137) * fVar152;
    fStack_3b0 = (fStack_1f0 * fVar246 +
                 fStack_210 * fVar197 + fVar103 * fVar136 + fStack_280 * fVar196) * fVar152;
    fStack_3ac = (fStack_1ec * fVar250 +
                 fStack_20c * fVar220 + fVar103 * fVar150 + fStack_27c * fVar198) * fVar152;
    fVar259 = (local_158 * fVar233 + local_228 * fVar184 + fVar105 * fVar108 + fVar125 * fVar183) *
              fVar152;
    local_398 = (fStack_154 * fVar243 + fStack_224 * fVar185 + fVar105 * fVar126 + fVar125 * fVar137
                ) * fVar152;
    fStack_394 = (fStack_150 * fVar246 +
                 fStack_220 * fVar197 + fVar105 * fVar136 + fVar125 * fVar196) * fVar152;
    fStack_390 = (fStack_14c * fVar250 +
                 fStack_21c * fVar220 + fVar105 * fVar150 + fVar125 * fVar198) * fVar152;
    local_388 = (local_168 * fVar233 + local_238 * fVar184 + local_258 * fVar108 + fVar60 * fVar183)
                * fVar152;
    fStack_384 = (fStack_164 * fVar243 +
                 fStack_234 * fVar185 + fStack_254 * fVar126 + fVar60 * fVar137) * fVar152;
    fStack_380 = (fStack_160 * fVar246 +
                 fStack_230 * fVar197 + fStack_250 * fVar136 + fVar60 * fVar196) * fVar152;
    fStack_37c = (fStack_15c * fVar250 +
                 fStack_22c * fVar220 + fStack_24c * fVar150 + fVar60 * fVar198) * fVar152;
    fVar126 = fVar152 * (fVar243 * fStack_204 +
                        fVar185 * fStack_244 + fVar126 * fStack_264 + fVar137 * fStack_274);
    fVar136 = fVar152 * (fVar246 * fStack_200 +
                        fVar197 * fStack_240 + fVar136 * fStack_260 + fVar196 * fStack_270);
    fVar150 = fVar152 * (fVar250 * fStack_1fc +
                        fVar220 * fStack_23c + fVar150 * fStack_25c + fVar198 * fStack_26c);
    auVar142._4_4_ = fVar271;
    auVar142._0_4_ = fVar252;
    auVar142._8_4_ = fVar262;
    auVar142._12_4_ = 0;
    auVar128._0_4_ =
         fVar251 + fVar152 * (fVar233 * local_208 +
                             fVar184 * local_248 + fVar108 * local_268 + fVar183 * local_278);
    auVar128._4_4_ = fVar252 + fVar126;
    auVar128._8_4_ = fVar271 + fVar136;
    auVar128._12_4_ = fVar262 + fVar150;
    auVar191._0_8_ = CONCAT44(fVar271 - fVar136,fVar252 - fVar126);
    auVar191._8_4_ = fVar262 - fVar150;
    auVar191._12_4_ = 0;
    fVar185 = fVar165 - fVar164;
    fVar197 = fVar166 - fVar165;
    fVar220 = fVar127 - fVar166;
    fVar222 = 0.0 - fVar127;
    fVar272 = fVar135 - fVar124;
    fVar275 = fVar138 - fVar135;
    fVar276 = fVar151 - fVar138;
    fVar277 = 0.0 - fVar151;
    fVar152 = fVar259 * fVar272 - local_388 * fVar185;
    fVar183 = local_398 * fVar275 - fStack_384 * fVar197;
    fVar184 = fStack_394 * fVar276 - fStack_380 * fVar220;
    fVar137 = fStack_390 * fVar277 - fStack_37c * fVar222;
    local_2f8._0_4_ = fVar281 - fVar278;
    local_2f8._4_4_ = fVar282 - fVar281;
    fStack_2f0 = fVar283 - fVar282;
    fStack_2ec = 0.0 - fVar283;
    fVar234 = local_388 * (float)local_2f8._0_4_ - local_3b8 * fVar272;
    fVar235 = fStack_384 * (float)local_2f8._4_4_ - fStack_3b4 * fVar275;
    fVar243 = fStack_380 * fStack_2f0 - fStack_3b0 * fVar276;
    fVar244 = fStack_37c * fStack_2ec - fStack_3ac * fVar277;
    fVar245 = local_3b8 * fVar185 - fVar259 * (float)local_2f8._0_4_;
    fVar246 = fStack_3b4 * fVar197 - local_398 * (float)local_2f8._4_4_;
    fVar247 = fStack_3b0 * fVar220 - fStack_394 * fStack_2f0;
    fVar248 = fStack_3ac * fVar222 - fStack_390 * fStack_2ec;
    auVar227._0_4_ = fVar185 * fVar185 + fVar272 * fVar272;
    auVar227._4_4_ = fVar197 * fVar197 + fVar275 * fVar275;
    auVar227._8_4_ = fVar220 * fVar220 + fVar276 * fVar276;
    auVar227._12_4_ = fVar222 * fVar222 + fVar277 * fVar277;
    auVar216._0_4_ = (float)local_2f8._0_4_ * (float)local_2f8._0_4_ + auVar227._0_4_;
    auVar216._4_4_ = (float)local_2f8._4_4_ * (float)local_2f8._4_4_ + auVar227._4_4_;
    auVar216._8_4_ = fStack_2f0 * fStack_2f0 + auVar227._8_4_;
    auVar216._12_4_ = fStack_2ec * fStack_2ec + auVar227._12_4_;
    auVar70 = rcpps(auVar227,auVar216);
    fVar108 = auVar70._0_4_;
    fVar126 = auVar70._4_4_;
    fVar136 = auVar70._8_4_;
    fVar150 = auVar70._12_4_;
    fVar108 = (1.0 - fVar108 * auVar216._0_4_) * fVar108 + fVar108;
    fVar126 = (1.0 - fVar126 * auVar216._4_4_) * fVar126 + fVar126;
    fVar136 = (1.0 - fVar136 * auVar216._8_4_) * fVar136 + fVar136;
    fVar150 = (1.0 - fVar150 * auVar216._12_4_) * fVar150 + fVar150;
    fVar250 = fVar272 * local_398 - fVar185 * fStack_384;
    fVar251 = fVar275 * fStack_394 - fVar197 * fStack_380;
    fVar252 = fVar276 * fStack_390 - fVar220 * fStack_37c;
    fVar253 = fVar277 * 0.0 - fVar222 * 0.0;
    local_3a8 = fStack_384;
    fStack_3a4 = fStack_380;
    fStack_3a0 = fStack_37c;
    fStack_39c = 0.0;
    fVar260 = (float)local_2f8._0_4_ * fStack_384 - fVar272 * fStack_3b4;
    fVar261 = (float)local_2f8._4_4_ * fStack_380 - fVar275 * fStack_3b0;
    fVar263 = fStack_2f0 * fStack_37c - fVar276 * fStack_3ac;
    fVar270 = fStack_2ec * 0.0 - fVar277 * 0.0;
    fStack_38c = 0.0;
    auVar279._8_4_ = fVar271;
    auVar279._0_8_ = uVar254;
    auVar279._12_4_ = fVar262;
    local_3c8 = fStack_3b4;
    fStack_3c4 = fStack_3b0;
    fStack_3c0 = fStack_3ac;
    fStack_3bc = 0.0;
    fVar196 = fVar185 * fStack_3b4 - (float)local_2f8._0_4_ * local_398;
    fVar198 = fVar197 * fStack_3b0 - (float)local_2f8._4_4_ * fStack_394;
    fVar221 = fVar220 * fStack_3ac - fStack_2f0 * fStack_390;
    fVar233 = fVar222 * 0.0 - fStack_2ec * 0.0;
    auVar156._0_4_ = (fVar152 * fVar152 + fVar234 * fVar234 + fVar245 * fVar245) * fVar108;
    auVar156._4_4_ = (fVar183 * fVar183 + fVar235 * fVar235 + fVar246 * fVar246) * fVar126;
    auVar156._8_4_ = (fVar184 * fVar184 + fVar243 * fVar243 + fVar247 * fVar247) * fVar136;
    auVar156._12_4_ = (fVar137 * fVar137 + fVar244 * fVar244 + fVar248 * fVar248) * fVar150;
    auVar238._0_4_ = (fVar250 * fVar250 + fVar260 * fVar260 + fVar196 * fVar196) * fVar108;
    auVar238._4_4_ = (fVar251 * fVar251 + fVar261 * fVar261 + fVar198 * fVar198) * fVar126;
    auVar238._8_4_ = (fVar252 * fVar252 + fVar263 * fVar263 + fVar221 * fVar221) * fVar136;
    auVar238._12_4_ = (fVar253 * fVar253 + fVar270 * fVar270 + fVar233 * fVar233) * fVar150;
    auVar237 = maxps(auVar156,auVar238);
    auVar112._8_4_ = fVar271;
    auVar112._0_8_ = uVar254;
    auVar112._12_4_ = fVar262;
    auVar70 = maxps(auVar112,auVar128);
    auVar228._8_4_ = auVar191._8_4_;
    auVar228._0_8_ = auVar191._0_8_;
    auVar228._12_4_ = 0;
    auVar229 = maxps(auVar228,auVar142);
    auVar70 = maxps(auVar70,auVar229);
    auVar280 = minps(auVar279,auVar128);
    auVar229 = minps(auVar191,auVar142);
    auVar280 = minps(auVar280,auVar229);
    auVar237 = sqrtps(auVar128,auVar237);
    auVar229 = rsqrtps(auVar237,auVar216);
    fVar108 = auVar229._0_4_;
    fVar126 = auVar229._4_4_;
    fVar136 = auVar229._8_4_;
    fVar150 = auVar229._12_4_;
    local_1b8 = fVar108 * 1.5 - fVar108 * fVar108 * auVar216._0_4_ * 0.5 * fVar108;
    fStack_1b4 = fVar126 * 1.5 - fVar126 * fVar126 * auVar216._4_4_ * 0.5 * fVar126;
    fStack_1b0 = fVar136 * 1.5 - fVar136 * fVar136 * auVar216._8_4_ * 0.5 * fVar136;
    fStack_1ac = fVar150 * 1.5 - fVar150 * fVar150 * auVar216._12_4_ * 0.5 * fVar150;
    fVar183 = 0.0 - fVar164;
    fVar184 = 0.0 - fVar165;
    fVar137 = 0.0 - fVar166;
    fVar196 = 0.0 - fVar127;
    local_3d8._0_4_ = 0.0 - fVar124;
    local_3d8._4_4_ = 0.0 - fVar135;
    fStack_3d0 = 0.0 - fVar138;
    fStack_3cc = 0.0 - fVar151;
    fVar198 = 0.0 - fVar278;
    fVar221 = 0.0 - fVar281;
    fVar233 = 0.0 - fVar282;
    fVar234 = 0.0 - fVar283;
    auVar16._4_4_ = fStack_364;
    auVar16._0_4_ = local_368;
    auVar16._8_4_ = fStack_360;
    auVar16._12_4_ = fStack_35c;
    local_308._0_4_ =
         local_368 * (float)local_2f8._0_4_ * local_1b8 +
         local_418 * fVar185 * local_1b8 + local_4e8 * fVar272 * local_1b8;
    local_308._4_4_ =
         fStack_364 * (float)local_2f8._4_4_ * fStack_1b4 +
         fStack_414 * fVar197 * fStack_1b4 + fStack_4e4 * fVar275 * fStack_1b4;
    fStack_300 = fStack_360 * fStack_2f0 * fStack_1b0 +
                 fStack_410 * fVar220 * fStack_1b0 + fStack_4e0 * fVar276 * fStack_1b0;
    fStack_2fc = fStack_35c * fStack_2ec * fStack_1ac +
                 fStack_40c * fVar222 * fStack_1ac + fStack_4dc * fVar277 * fStack_1ac;
    local_2b8 = (float)local_2f8._0_4_ * local_1b8 * fVar198 +
                fVar185 * local_1b8 * fVar183 + fVar272 * local_1b8 * (float)local_3d8._0_4_;
    fStack_2b4 = (float)local_2f8._4_4_ * fStack_1b4 * fVar221 +
                 fVar197 * fStack_1b4 * fVar184 + fVar275 * fStack_1b4 * (float)local_3d8._4_4_;
    fStack_2b0 = fStack_2f0 * fStack_1b0 * fVar233 +
                 fVar220 * fStack_1b0 * fVar137 + fVar276 * fStack_1b0 * fStack_3d0;
    fStack_2ac = fStack_2ec * fStack_1ac * fVar234 +
                 fVar222 * fStack_1ac * fVar196 + fVar277 * fStack_1ac * fStack_3cc;
    local_178 = (local_368 * fVar198 + local_418 * fVar183 + local_4e8 * (float)local_3d8._0_4_) -
                (float)local_308._0_4_ * local_2b8;
    fStack_174 = (fStack_364 * fVar221 + fStack_414 * fVar184 + fStack_4e4 * (float)local_3d8._4_4_)
                 - (float)local_308._4_4_ * fStack_2b4;
    fStack_170 = (fStack_360 * fVar233 + fStack_410 * fVar137 + fStack_4e0 * fStack_3d0) -
                 fStack_300 * fStack_2b0;
    fStack_16c = (fStack_35c * fVar234 + fStack_40c * fVar196 + fStack_4dc * fStack_3cc) -
                 fStack_2fc * fStack_2ac;
    fVar108 = (fVar198 * fVar198 +
              fVar183 * fVar183 + (float)local_3d8._0_4_ * (float)local_3d8._0_4_) -
              local_2b8 * local_2b8;
    fStack_4b4 = (fVar221 * fVar221 +
                 fVar184 * fVar184 + (float)local_3d8._4_4_ * (float)local_3d8._4_4_) -
                 fStack_2b4 * fStack_2b4;
    fStack_4b0 = (fVar233 * fVar233 + fVar137 * fVar137 + fStack_3d0 * fStack_3d0) -
                 fStack_2b0 * fStack_2b0;
    fStack_4ac = (fVar234 * fVar234 + fVar196 * fVar196 + fStack_3cc * fStack_3cc) -
                 fStack_2ac * fStack_2ac;
    fVar126 = (auVar70._0_4_ + auVar237._0_4_) * 1.0000002;
    fVar136 = (auVar70._4_4_ + auVar237._4_4_) * 1.0000002;
    fVar150 = (auVar70._8_4_ + auVar237._8_4_) * 1.0000002;
    fVar152 = (auVar70._12_4_ + auVar237._12_4_) * 1.0000002;
    auVar192._0_4_ = fVar108 - fVar126 * fVar126;
    auVar192._4_4_ = fStack_4b4 - fVar136 * fVar136;
    auVar192._8_4_ = fStack_4b0 - fVar150 * fVar150;
    auVar192._12_4_ = fStack_4ac - fVar152 * fVar152;
    local_318 = (float)local_308._0_4_ * (float)local_308._0_4_;
    fStack_314 = (float)local_308._4_4_ * (float)local_308._4_4_;
    fStack_310 = fStack_300 * fStack_300;
    fStack_30c = fStack_2fc * fStack_2fc;
    local_2a8 = local_148 - local_318;
    fStack_2a4 = fStack_144 - fStack_314;
    fStack_2a0 = fStack_140 - fStack_310;
    fStack_29c = fStack_13c - fStack_30c;
    local_178 = local_178 + local_178;
    fStack_174 = fStack_174 + fStack_174;
    fStack_170 = fStack_170 + fStack_170;
    fStack_16c = fStack_16c + fStack_16c;
    auVar113._0_4_ = local_178 * local_178 - local_2a8 * 4.0 * auVar192._0_4_;
    auVar113._4_4_ = fStack_174 * fStack_174 - fStack_2a4 * 4.0 * auVar192._4_4_;
    auVar113._8_4_ = fStack_170 * fStack_170 - fStack_2a0 * 4.0 * auVar192._8_4_;
    auVar113._12_4_ = fStack_16c * fStack_16c - fStack_29c * 4.0 * auVar192._12_4_;
    local_478._4_4_ = (auVar280._4_4_ - auVar237._4_4_) * 0.99999976;
    local_478._0_4_ = (auVar280._0_4_ - auVar237._0_4_) * 0.99999976;
    fStack_470 = (auVar280._8_4_ - auVar237._8_4_) * 0.99999976;
    fStack_46c = (auVar280._12_4_ - auVar237._12_4_) * 0.99999976;
    auVar129._4_4_ = -(uint)(0.0 <= auVar113._4_4_);
    auVar129._0_4_ = -(uint)(0.0 <= auVar113._0_4_);
    auVar129._8_4_ = -(uint)(0.0 <= auVar113._8_4_);
    auVar129._12_4_ = -(uint)(0.0 <= auVar113._12_4_);
    uVar50 = (undefined4)(uVar46 >> 0x20);
    iVar44 = movmskps((int)uVar46,auVar129);
    if (iVar44 == 0) {
      iVar44 = 0;
      auVar193 = _DAT_01f7aa00;
      auVar217 = _DAT_01f7a9f0;
    }
    else {
      auVar237 = sqrtps(auVar16,auVar113);
      bVar10 = 0.0 <= auVar113._0_4_;
      uVar57 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar113._4_4_;
      uVar58 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar113._8_4_;
      uVar61 = -(uint)bVar12;
      bVar13 = 0.0 <= auVar113._12_4_;
      uVar104 = -(uint)bVar13;
      auVar157._0_4_ = local_2a8 + local_2a8;
      auVar157._4_4_ = fStack_2a4 + fStack_2a4;
      auVar157._8_4_ = fStack_2a0 + fStack_2a0;
      auVar157._12_4_ = fStack_29c + fStack_29c;
      auVar70 = rcpps(auVar192,auVar157);
      fVar235 = auVar70._0_4_;
      fVar243 = auVar70._4_4_;
      fVar244 = auVar70._8_4_;
      fVar245 = auVar70._12_4_;
      fVar235 = (1.0 - auVar157._0_4_ * fVar235) * fVar235 + fVar235;
      fVar243 = (1.0 - auVar157._4_4_ * fVar243) * fVar243 + fVar243;
      fVar244 = (1.0 - auVar157._8_4_ * fVar244) * fVar244 + fVar244;
      fVar245 = (1.0 - auVar157._12_4_ * fVar245) * fVar245 + fVar245;
      fVar126 = (-local_178 - auVar237._0_4_) * fVar235;
      fVar136 = (-fStack_174 - auVar237._4_4_) * fVar243;
      fVar150 = (-fStack_170 - auVar237._8_4_) * fVar244;
      fVar152 = (-fStack_16c - auVar237._12_4_) * fVar245;
      fVar235 = (auVar237._0_4_ - local_178) * fVar235;
      fVar243 = (auVar237._4_4_ - fStack_174) * fVar243;
      fVar244 = (auVar237._8_4_ - fStack_170) * fVar244;
      fVar245 = (auVar237._12_4_ - fStack_16c) * fVar245;
      local_1a8 = ((float)local_308._0_4_ * fVar126 + local_2b8) * local_1b8;
      fStack_1a4 = ((float)local_308._4_4_ * fVar136 + fStack_2b4) * fStack_1b4;
      fStack_1a0 = (fStack_300 * fVar150 + fStack_2b0) * fStack_1b0;
      fStack_19c = (fStack_2fc * fVar152 + fStack_2ac) * fStack_1ac;
      local_428._4_4_ = ((float)local_308._4_4_ * fVar243 + fStack_2b4) * fStack_1b4;
      local_428._0_4_ = ((float)local_308._0_4_ * fVar235 + local_2b8) * local_1b8;
      fStack_420 = (fStack_300 * fVar244 + fStack_2b0) * fStack_1b0;
      fStack_41c = (fStack_2fc * fVar245 + fStack_2ac) * fStack_1ac;
      auVar158._0_4_ = (uint)fVar126 & uVar57;
      auVar158._4_4_ = (uint)fVar136 & uVar58;
      auVar158._8_4_ = (uint)fVar150 & uVar61;
      auVar158._12_4_ = (uint)fVar152 & uVar104;
      auVar217._0_8_ = CONCAT44(~uVar58,~uVar57) & 0x7f8000007f800000;
      auVar217._8_4_ = ~uVar61 & 0x7f800000;
      auVar217._12_4_ = ~uVar104 & 0x7f800000;
      auVar217 = auVar217 | auVar158;
      auVar256._0_4_ = (uint)fVar235 & uVar57;
      auVar256._4_4_ = (uint)fVar243 & uVar58;
      auVar256._8_4_ = (uint)fVar244 & uVar61;
      auVar256._12_4_ = (uint)fVar245 & uVar104;
      auVar193._0_8_ = CONCAT44(~uVar58,~uVar57) & 0xff800000ff800000;
      auVar193._8_4_ = ~uVar61 & 0xff800000;
      auVar193._12_4_ = ~uVar104 & 0xff800000;
      auVar193 = auVar193 | auVar256;
      auVar230._0_8_ = CONCAT44(fStack_314,local_318) & 0x7fffffff7fffffff;
      auVar230._8_4_ = ABS(fStack_310);
      auVar230._12_4_ = ABS(fStack_30c);
      auVar25._4_4_ = fStack_294;
      auVar25._0_4_ = local_298;
      auVar25._8_4_ = fStack_290;
      auVar25._12_4_ = fStack_28c;
      auVar70 = maxps(auVar25,auVar230);
      fVar126 = auVar70._0_4_ * 1.9073486e-06;
      fVar136 = auVar70._4_4_ * 1.9073486e-06;
      fVar150 = auVar70._8_4_ * 1.9073486e-06;
      fVar152 = auVar70._12_4_ * 1.9073486e-06;
      auVar257._0_4_ = -(uint)(ABS(local_2a8) < fVar126 && bVar10);
      auVar257._4_4_ = -(uint)(ABS(fStack_2a4) < fVar136 && bVar11);
      auVar257._8_4_ = -(uint)(ABS(fStack_2a0) < fVar150 && bVar12);
      auVar257._12_4_ = -(uint)(ABS(fStack_29c) < fVar152 && bVar13);
      iVar44 = movmskps(iVar44,auVar257);
      if (iVar44 != 0) {
        uVar57 = -(uint)(auVar192._0_4_ <= 0.0);
        uVar58 = -(uint)(auVar192._4_4_ <= 0.0);
        uVar61 = -(uint)(auVar192._8_4_ <= 0.0);
        uVar104 = -(uint)(auVar192._12_4_ <= 0.0);
        auVar159._0_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar257._0_4_;
        auVar159._4_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar257._4_4_;
        auVar159._8_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar257._8_4_;
        auVar159._12_4_ = (uVar104 & 0xff800000 | ~uVar104 & 0x7f800000) & auVar257._12_4_;
        auVar82._0_4_ = ~auVar257._0_4_ & auVar217._0_4_;
        auVar82._4_4_ = ~auVar257._4_4_ & auVar217._4_4_;
        auVar82._8_4_ = ~auVar257._8_4_ & auVar217._8_4_;
        auVar82._12_4_ = ~auVar257._12_4_ & auVar217._12_4_;
        auVar160._0_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar257._0_4_;
        auVar160._4_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar257._4_4_;
        auVar160._8_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar257._8_4_;
        auVar160._12_4_ = (uVar104 & 0x7f800000 | ~uVar104 & 0xff800000) & auVar257._12_4_;
        auVar258._0_4_ = ~auVar257._0_4_ & auVar193._0_4_;
        auVar258._4_4_ = ~auVar257._4_4_ & auVar193._4_4_;
        auVar258._8_4_ = ~auVar257._8_4_ & auVar193._8_4_;
        auVar258._12_4_ = ~auVar257._12_4_ & auVar193._12_4_;
        auVar129._4_4_ = -(uint)((fVar136 <= ABS(fStack_2a4) || auVar192._4_4_ <= 0.0) && bVar11);
        auVar129._0_4_ = -(uint)((fVar126 <= ABS(local_2a8) || auVar192._0_4_ <= 0.0) && bVar10);
        auVar129._8_4_ = -(uint)((fVar150 <= ABS(fStack_2a0) || auVar192._8_4_ <= 0.0) && bVar12);
        auVar129._12_4_ = -(uint)((fVar152 <= ABS(fStack_29c) || auVar192._12_4_ <= 0.0) && bVar13);
        auVar193 = auVar258 | auVar160;
        auVar217 = auVar82 | auVar159;
      }
    }
    auVar130._0_4_ = (auVar129._0_4_ << 0x1f) >> 0x1f;
    auVar130._4_4_ = (auVar129._4_4_ << 0x1f) >> 0x1f;
    auVar130._8_4_ = (auVar129._8_4_ << 0x1f) >> 0x1f;
    auVar130._12_4_ = (auVar129._12_4_ << 0x1f) >> 0x1f;
    auVar130 = auVar130 & local_198;
    iVar44 = movmskps(iVar44,auVar130);
    if (iVar44 == 0) {
LAB_00a7823c:
      pauVar49 = (undefined1 (*) [16])CONCAT44(uVar50,iVar44);
    }
    else {
      auVar273._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2e8._0_4_;
      auVar273._4_4_ = auVar273._0_4_;
      auVar273._8_4_ = auVar273._0_4_;
      auVar273._12_4_ = auVar273._0_4_;
      auVar229 = maxps(auVar273,auVar217);
      auVar218._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2e8._0_4_;
      auVar218._4_4_ = auVar218._0_4_;
      auVar218._8_4_ = auVar218._0_4_;
      auVar218._12_4_ = auVar218._0_4_;
      auVar237 = minps(auVar218,auVar193);
      auVar83._0_4_ = fVar259 * local_418 + local_388 * local_4e8;
      auVar83._4_4_ = local_398 * fStack_414 + fStack_384 * fStack_4e4;
      auVar83._8_4_ = fStack_394 * fStack_410 + fStack_380 * fStack_4e0;
      auVar83._12_4_ = fStack_390 * fStack_40c + fStack_37c * fStack_4dc;
      auVar171._0_4_ = local_3b8 * local_368 + auVar83._0_4_;
      auVar171._4_4_ = fStack_3b4 * fStack_364 + auVar83._4_4_;
      auVar171._8_4_ = fStack_3b0 * fStack_360 + auVar83._8_4_;
      auVar171._12_4_ = fStack_3ac * fStack_35c + auVar83._12_4_;
      auVar70 = rcpps(auVar83,auVar171);
      fVar126 = auVar70._0_4_;
      fVar136 = auVar70._4_4_;
      fVar150 = auVar70._8_4_;
      fVar152 = auVar70._12_4_;
      fVar126 = ((1.0 - auVar171._0_4_ * fVar126) * fVar126 + fVar126) *
                -(fVar198 * local_3b8 + fVar183 * fVar259 + (float)local_3d8._0_4_ * local_388);
      fVar136 = ((1.0 - auVar171._4_4_ * fVar136) * fVar136 + fVar136) *
                -(fVar221 * fStack_3b4 + fVar184 * local_398 + (float)local_3d8._4_4_ * fStack_384);
      fVar150 = ((1.0 - auVar171._8_4_ * fVar150) * fVar150 + fVar150) *
                -(fVar233 * fStack_3b0 + fVar137 * fStack_394 + fStack_3d0 * fStack_380);
      fVar152 = ((1.0 - auVar171._12_4_ * fVar152) * fVar152 + fVar152) *
                -(fVar234 * fStack_3ac + fVar196 * fStack_390 + fStack_3cc * fStack_37c);
      auVar239._0_12_ = ZEXT812(0);
      auVar239._12_4_ = 0;
      uVar57 = -(uint)(auVar171._0_4_ < 0.0 || ABS(auVar171._0_4_) < 1e-18);
      uVar58 = -(uint)(auVar171._4_4_ < 0.0 || ABS(auVar171._4_4_) < 1e-18);
      uVar61 = -(uint)(auVar171._8_4_ < 0.0 || ABS(auVar171._8_4_) < 1e-18);
      uVar104 = -(uint)(auVar171._12_4_ < 0.0 || ABS(auVar171._12_4_) < 1e-18);
      auVar161._0_8_ = CONCAT44(uVar58,uVar57) & 0xff800000ff800000;
      auVar161._8_4_ = uVar61 & 0xff800000;
      auVar161._12_4_ = uVar104 & 0xff800000;
      auVar84._0_4_ = ~uVar57 & (uint)fVar126;
      auVar84._4_4_ = ~uVar58 & (uint)fVar136;
      auVar84._8_4_ = ~uVar61 & (uint)fVar150;
      auVar84._12_4_ = ~uVar104 & (uint)fVar152;
      auVar229 = maxps(auVar229,auVar84 | auVar161);
      uVar57 = -(uint)(0.0 < auVar171._0_4_ || ABS(auVar171._0_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar171._4_4_ || ABS(auVar171._4_4_) < 1e-18);
      uVar61 = -(uint)(0.0 < auVar171._8_4_ || ABS(auVar171._8_4_) < 1e-18);
      uVar104 = -(uint)(0.0 < auVar171._12_4_ || ABS(auVar171._12_4_) < 1e-18);
      auVar85._0_8_ = CONCAT44(uVar58,uVar57) & 0x7f8000007f800000;
      auVar85._8_4_ = uVar61 & 0x7f800000;
      auVar85._12_4_ = uVar104 & 0x7f800000;
      auVar172._0_4_ = ~uVar57 & (uint)fVar126;
      auVar172._4_4_ = ~uVar58 & (uint)fVar136;
      auVar172._8_4_ = ~uVar61 & (uint)fVar150;
      auVar172._12_4_ = ~uVar104 & (uint)fVar152;
      auVar237 = minps(auVar237,auVar172 | auVar85);
      auVar114._0_4_ = (0.0 - fVar165) * -local_398 + (0.0 - fVar135) * -fStack_384;
      auVar114._4_4_ = (0.0 - fVar166) * -fStack_394 + (0.0 - fVar138) * -fStack_380;
      auVar114._8_4_ = (0.0 - fVar127) * -fStack_390 + (0.0 - fVar151) * -fStack_37c;
      auVar114._12_4_ = 0x80000000;
      auVar264._0_4_ = -fStack_3b4 * local_368 + -local_398 * local_418 + -fStack_384 * local_4e8;
      auVar264._4_4_ =
           -fStack_3b0 * fStack_364 + -fStack_394 * fStack_414 + -fStack_380 * fStack_4e4;
      auVar264._8_4_ =
           -fStack_3ac * fStack_360 + -fStack_390 * fStack_410 + -fStack_37c * fStack_4e0;
      auVar264._12_4_ = fStack_35c * -0.0 + fStack_40c * -0.0 + fStack_4dc * -0.0;
      auVar70 = rcpps(auVar114,auVar264);
      fVar126 = auVar70._0_4_;
      fVar136 = auVar70._4_4_;
      fVar150 = auVar70._8_4_;
      fVar152 = auVar70._12_4_;
      fVar126 = (((float)DAT_01f7ba10 - auVar264._0_4_ * fVar126) * fVar126 + fVar126) *
                -((0.0 - fVar281) * -fStack_3b4 + auVar114._0_4_);
      fVar136 = ((DAT_01f7ba10._4_4_ - auVar264._4_4_ * fVar136) * fVar136 + fVar136) *
                -((0.0 - fVar282) * -fStack_3b0 + auVar114._4_4_);
      fVar150 = ((DAT_01f7ba10._8_4_ - auVar264._8_4_ * fVar150) * fVar150 + fVar150) *
                -((0.0 - fVar283) * -fStack_3ac + auVar114._8_4_);
      fVar152 = ((DAT_01f7ba10._12_4_ - auVar264._12_4_ * fVar152) * fVar152 + fVar152) * 0.0;
      uVar57 = -(uint)(auVar264._0_4_ < 0.0 || ABS(auVar264._0_4_) < 1e-18);
      uVar58 = -(uint)(auVar264._4_4_ < 0.0 || ABS(auVar264._4_4_) < 1e-18);
      uVar61 = -(uint)(auVar264._8_4_ < 0.0 || ABS(auVar264._8_4_) < 1e-18);
      uVar104 = -(uint)(auVar264._12_4_ < 0.0 || ABS(auVar264._12_4_) < 1e-18);
      auVar115._0_8_ = CONCAT44(uVar58,uVar57) & 0xff800000ff800000;
      auVar115._8_4_ = uVar61 & 0xff800000;
      auVar115._12_4_ = uVar104 & 0xff800000;
      auVar86._0_4_ = ~uVar57 & (uint)fVar126;
      auVar86._4_4_ = ~uVar58 & (uint)fVar136;
      auVar86._8_4_ = ~uVar61 & (uint)fVar150;
      auVar86._12_4_ = ~uVar104 & (uint)fVar152;
      _local_3f8 = maxps(auVar229,auVar86 | auVar115);
      uVar57 = -(uint)(0.0 < auVar264._0_4_ || ABS(auVar264._0_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar264._4_4_ || ABS(auVar264._4_4_) < 1e-18);
      uVar61 = -(uint)(0.0 < auVar264._8_4_ || ABS(auVar264._8_4_) < 1e-18);
      uVar104 = -(uint)(0.0 < auVar264._12_4_ || ABS(auVar264._12_4_) < 1e-18);
      auVar231._0_8_ = CONCAT44(uVar58,uVar57) & 0x7f8000007f800000;
      auVar231._8_4_ = uVar61 & 0x7f800000;
      auVar231._12_4_ = uVar104 & 0x7f800000;
      auVar265._0_4_ = ~uVar57 & (uint)fVar126;
      auVar265._4_4_ = ~uVar58 & (uint)fVar136;
      auVar265._8_4_ = ~uVar61 & (uint)fVar150;
      auVar265._12_4_ = ~uVar104 & (uint)fVar152;
      local_1d8 = minps(auVar237,auVar265 | auVar231);
      fVar126 = local_3f8._0_4_;
      fVar136 = local_3f8._4_4_;
      fVar150 = local_3f8._8_4_;
      fVar152 = local_3f8._12_4_;
      auVar274._0_4_ = -(uint)(fVar126 <= local_1d8._0_4_) & auVar130._0_4_;
      auVar274._4_4_ = -(uint)(fVar136 <= local_1d8._4_4_) & auVar130._4_4_;
      auVar274._8_4_ = -(uint)(fVar150 <= local_1d8._8_4_) & auVar130._8_4_;
      auVar274._12_4_ = -(uint)(fVar152 <= local_1d8._12_4_) & auVar130._12_4_;
      iVar44 = movmskps(iVar44,auVar274);
      if (iVar44 == 0) goto LAB_00a7823c;
      auVar237 = maxps(ZEXT816(0),_local_478);
      auVar27._4_4_ = fStack_1a4;
      auVar27._0_4_ = local_1a8;
      auVar27._8_4_ = fStack_1a0;
      auVar27._12_4_ = fStack_19c;
      auVar70 = minps(auVar27,_DAT_01f7ba10);
      auVar162._0_12_ = ZEXT812(0);
      auVar162._12_4_ = 0.0;
      auVar229 = maxps(auVar70,auVar162);
      auVar70 = minps(_local_428,_DAT_01f7ba10);
      auVar70 = maxps(auVar70,auVar162);
      local_108[0] = (auVar229._0_4_ + (float)DAT_01f80df0) * 0.25 * local_3e8 + local_188;
      local_108[1] = (auVar229._4_4_ + DAT_01f80df0._4_4_) * 0.25 * local_3e8 + local_188;
      local_108[2] = (auVar229._8_4_ + DAT_01f80df0._8_4_) * 0.25 * local_3e8 + local_188;
      local_108[3] = (auVar229._12_4_ + DAT_01f80df0._12_4_) * 0.25 * local_3e8 + local_188;
      local_118[0] = (auVar70._0_4_ + (float)DAT_01f80df0) * 0.25 * local_3e8 + local_188;
      local_118[1] = (auVar70._4_4_ + DAT_01f80df0._4_4_) * 0.25 * local_3e8 + local_188;
      local_118[2] = (auVar70._8_4_ + DAT_01f80df0._8_4_) * 0.25 * local_3e8 + local_188;
      local_118[3] = (auVar70._12_4_ + DAT_01f80df0._12_4_) * 0.25 * local_3e8 + local_188;
      fVar108 = fVar108 - auVar237._0_4_ * auVar237._0_4_;
      fVar183 = fStack_4b4 - auVar237._4_4_ * auVar237._4_4_;
      fVar184 = fStack_4b0 - auVar237._8_4_ * auVar237._8_4_;
      fVar137 = fStack_4ac - auVar237._12_4_ * auVar237._12_4_;
      auVar194._0_4_ = local_178 * local_178 - local_2a8 * 4.0 * fVar108;
      auVar194._4_4_ = fStack_174 * fStack_174 - fStack_2a4 * 4.0 * fVar183;
      auVar194._8_4_ = fStack_170 * fStack_170 - fStack_2a0 * 4.0 * fVar184;
      auVar194._12_4_ = fStack_16c * fStack_16c - fStack_29c * 4.0 * fVar137;
      local_428._4_4_ = -(uint)(0.0 <= auVar194._4_4_);
      local_428._0_4_ = -(uint)(0.0 <= auVar194._0_4_);
      fStack_420 = (float)-(uint)(0.0 <= auVar194._8_4_);
      fStack_41c = (float)-(uint)(0.0 <= auVar194._12_4_);
      iVar44 = movmskps(iVar44,_local_428);
      if (iVar44 == 0) {
        _local_558 = ZEXT816(0);
        fVar164 = 0.0;
        fVar165 = 0.0;
        fVar166 = 0.0;
        fVar127 = 0.0;
        _local_538 = ZEXT816(0);
        _local_548 = ZEXT816(0);
        _local_478 = ZEXT816(0);
        iVar44 = 0;
        auVar131 = _DAT_01f7aa00;
        auVar219 = _DAT_01f7a9f0;
      }
      else {
        auVar237 = sqrtps(auVar239,auVar194);
        auVar116._0_4_ = local_2a8 + local_2a8;
        auVar116._4_4_ = fStack_2a4 + fStack_2a4;
        auVar116._8_4_ = fStack_2a0 + fStack_2a0;
        auVar116._12_4_ = fStack_29c + fStack_29c;
        auVar70 = rcpps(_DAT_01f80df0,auVar116);
        fVar234 = auVar70._0_4_;
        fVar235 = auVar70._4_4_;
        fVar243 = auVar70._8_4_;
        fVar244 = auVar70._12_4_;
        fVar234 = ((float)DAT_01f7ba10 - auVar116._0_4_ * fVar234) * fVar234 + fVar234;
        fVar235 = (DAT_01f7ba10._4_4_ - auVar116._4_4_ * fVar235) * fVar235 + fVar235;
        fVar243 = (DAT_01f7ba10._8_4_ - auVar116._8_4_ * fVar243) * fVar243 + fVar243;
        fVar244 = (DAT_01f7ba10._12_4_ - auVar116._12_4_ * fVar244) * fVar244 + fVar244;
        fVar245 = (-local_178 - auVar237._0_4_) * fVar234;
        fVar246 = (-fStack_174 - auVar237._4_4_) * fVar235;
        fVar247 = (-fStack_170 - auVar237._8_4_) * fVar243;
        fVar248 = (-fStack_16c - auVar237._12_4_) * fVar244;
        fVar234 = (auVar237._0_4_ - local_178) * fVar234;
        fVar235 = (auVar237._4_4_ - fStack_174) * fVar235;
        fVar243 = (auVar237._8_4_ - fStack_170) * fVar243;
        fVar244 = (auVar237._12_4_ - fStack_16c) * fVar244;
        fVar196 = ((float)local_308._0_4_ * fVar245 + local_2b8) * local_1b8;
        fVar198 = ((float)local_308._4_4_ * fVar246 + fStack_2b4) * fStack_1b4;
        fVar221 = (fStack_300 * fVar247 + fStack_2b0) * fStack_1b0;
        fVar233 = (fStack_2fc * fVar248 + fStack_2ac) * fStack_1ac;
        local_538._4_4_ = fStack_364 * fVar246 - ((float)local_2f8._4_4_ * fVar198 + fVar281);
        local_538._0_4_ = local_368 * fVar245 - ((float)local_2f8._0_4_ * fVar196 + fVar278);
        fStack_530 = fStack_360 * fVar247 - (fStack_2f0 * fVar221 + fVar282);
        fStack_52c = fStack_35c * fVar248 - (fStack_2ec * fVar233 + fVar283);
        local_548._4_4_ = fStack_414 * fVar246 - (fVar197 * fVar198 + fVar165);
        local_548._0_4_ = local_418 * fVar245 - (fVar185 * fVar196 + fVar164);
        fStack_540 = fStack_410 * fVar247 - (fVar220 * fVar221 + fVar166);
        fStack_53c = fStack_40c * fVar248 - (fVar222 * fVar233 + fVar127);
        local_478._4_4_ = fStack_4e4 * fVar246 - (fVar198 * fVar275 + fVar135);
        local_478._0_4_ = local_4e8 * fVar245 - (fVar196 * fVar272 + fVar124);
        fStack_470 = fStack_4e0 * fVar247 - (fVar221 * fVar276 + fVar138);
        fStack_46c = fStack_4dc * fVar248 - (fVar233 * fVar277 + fVar151);
        fVar196 = ((float)local_308._0_4_ * fVar234 + local_2b8) * local_1b8;
        fVar198 = ((float)local_308._4_4_ * fVar235 + fStack_2b4) * fStack_1b4;
        fVar221 = (fStack_300 * fVar243 + fStack_2b0) * fStack_1b0;
        fVar233 = (fStack_2fc * fVar244 + fStack_2ac) * fStack_1ac;
        local_558._4_4_ = fStack_364 * fVar235 - ((float)local_2f8._4_4_ * fVar198 + fVar281);
        local_558._0_4_ = local_368 * fVar234 - ((float)local_2f8._0_4_ * fVar196 + fVar278);
        fStack_550 = fStack_360 * fVar243 - (fStack_2f0 * fVar221 + fVar282);
        fStack_54c = fStack_35c * fVar244 - (fStack_2ec * fVar233 + fVar283);
        fVar164 = local_418 * fVar234 - (fVar185 * fVar196 + fVar164);
        fVar165 = fStack_414 * fVar235 - (fVar197 * fVar198 + fVar165);
        fVar166 = fStack_410 * fVar243 - (fVar220 * fVar221 + fVar166);
        fVar127 = fStack_40c * fVar244 - (fVar222 * fVar233 + fVar127);
        bVar10 = 0.0 <= auVar194._0_4_;
        uVar57 = -(uint)bVar10;
        bVar11 = 0.0 <= auVar194._4_4_;
        uVar58 = -(uint)bVar11;
        bVar12 = 0.0 <= auVar194._8_4_;
        uVar61 = -(uint)bVar12;
        bVar13 = 0.0 <= auVar194._12_4_;
        uVar104 = -(uint)bVar13;
        auVar162._0_4_ = local_4e8 * fVar234 - (fVar196 * fVar272 + fVar124);
        auVar162._4_4_ = fStack_4e4 * fVar235 - (fVar198 * fVar275 + fVar135);
        auVar162._8_4_ = fStack_4e0 * fVar243 - (fVar221 * fVar276 + fVar138);
        auVar162._12_4_ = fStack_4dc * fVar244 - (fVar233 * fVar277 + fVar151);
        auVar195._0_4_ = (uint)fVar245 & uVar57;
        auVar195._4_4_ = (uint)fVar246 & uVar58;
        auVar195._8_4_ = (uint)fVar247 & uVar61;
        auVar195._12_4_ = (uint)fVar248 & uVar104;
        auVar219._0_8_ = CONCAT44(~uVar58,~uVar57) & 0x7f8000007f800000;
        auVar219._8_4_ = ~uVar61 & 0x7f800000;
        auVar219._12_4_ = ~uVar104 & 0x7f800000;
        auVar219 = auVar219 | auVar195;
        auVar240._0_4_ = (uint)fVar234 & uVar57;
        auVar240._4_4_ = (uint)fVar235 & uVar58;
        auVar240._8_4_ = (uint)fVar243 & uVar61;
        auVar240._12_4_ = (uint)fVar244 & uVar104;
        auVar131._0_8_ = CONCAT44(~uVar58,~uVar57) & 0xff800000ff800000;
        auVar131._8_4_ = ~uVar61 & 0xff800000;
        auVar131._12_4_ = ~uVar104 & 0xff800000;
        auVar131 = auVar131 | auVar240;
        auVar87._0_8_ = CONCAT44(fStack_314,local_318) & 0x7fffffff7fffffff;
        auVar87._8_4_ = ABS(fStack_310);
        auVar87._12_4_ = ABS(fStack_30c);
        auVar26._4_4_ = fStack_294;
        auVar26._0_4_ = local_298;
        auVar26._8_4_ = fStack_290;
        auVar26._12_4_ = fStack_28c;
        auVar70 = maxps(auVar26,auVar87);
        fVar124 = auVar70._0_4_ * 1.9073486e-06;
        fVar135 = auVar70._4_4_ * 1.9073486e-06;
        fVar138 = auVar70._8_4_ * 1.9073486e-06;
        fVar151 = auVar70._12_4_ * 1.9073486e-06;
        auVar173._0_4_ = -(uint)(ABS(local_2a8) < fVar124 && bVar10);
        auVar173._4_4_ = -(uint)(ABS(fStack_2a4) < fVar135 && bVar11);
        auVar173._8_4_ = -(uint)(ABS(fStack_2a0) < fVar138 && bVar12);
        auVar173._12_4_ = -(uint)(ABS(fStack_29c) < fVar151 && bVar13);
        iVar44 = movmskps(iVar44,auVar173);
        fStack_4b4 = fVar183;
        fStack_4b0 = fVar184;
        fStack_4ac = fVar137;
        if (iVar44 != 0) {
          uVar57 = -(uint)(fVar108 <= 0.0);
          uVar58 = -(uint)(fVar183 <= 0.0);
          uVar61 = -(uint)(fVar184 <= 0.0);
          uVar104 = -(uint)(fVar137 <= 0.0);
          auVar241._0_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar173._0_4_;
          auVar241._4_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar173._4_4_;
          auVar241._8_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar173._8_4_;
          auVar241._12_4_ = (uVar104 & 0xff800000 | ~uVar104 & 0x7f800000) & auVar173._12_4_;
          auVar232._0_4_ = ~auVar173._0_4_ & auVar219._0_4_;
          auVar232._4_4_ = ~auVar173._4_4_ & auVar219._4_4_;
          auVar232._8_4_ = ~auVar173._8_4_ & auVar219._8_4_;
          auVar232._12_4_ = ~auVar173._12_4_ & auVar219._12_4_;
          auVar242._0_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar173._0_4_;
          auVar242._4_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar173._4_4_;
          auVar242._8_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar173._8_4_;
          auVar242._12_4_ = (uVar104 & 0x7f800000 | ~uVar104 & 0xff800000) & auVar173._12_4_;
          auVar174._0_4_ = ~auVar173._0_4_ & auVar131._0_4_;
          auVar174._4_4_ = ~auVar173._4_4_ & auVar131._4_4_;
          auVar174._8_4_ = ~auVar173._8_4_ & auVar131._8_4_;
          auVar174._12_4_ = ~auVar173._12_4_ & auVar131._12_4_;
          local_428._4_4_ = -(uint)((fVar135 <= ABS(fStack_2a4) || fVar183 <= 0.0) && bVar11);
          local_428._0_4_ = -(uint)((fVar124 <= ABS(local_2a8) || fVar108 <= 0.0) && bVar10);
          fStack_420 = (float)-(uint)((fVar138 <= ABS(fStack_2a0) || fVar184 <= 0.0) && bVar12);
          fStack_41c = (float)-(uint)((fVar151 <= ABS(fStack_29c) || fVar137 <= 0.0) && bVar13);
          auVar131 = auVar174 | auVar242;
          auVar219 = auVar232 | auVar241;
        }
      }
      fVar108 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar124 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar135 = (ray->super_RayK<1>).dir.field_0.m128[2];
      _local_138 = _local_3f8;
      local_128 = minps(local_1d8,auVar219);
      _local_488 = maxps(_local_3f8,auVar131);
      _local_1e8 = _local_488;
      local_2f8._0_4_ = -(uint)(fVar126 <= local_128._0_4_) & auVar274._0_4_;
      local_2f8._4_4_ = -(uint)(fVar136 <= local_128._4_4_) & auVar274._4_4_;
      fStack_2f0 = (float)(-(uint)(fVar150 <= local_128._8_4_) & auVar274._8_4_);
      fStack_2ec = (float)(-(uint)(fVar152 <= local_128._12_4_) & auVar274._12_4_);
      local_308 = (undefined1  [8])
                  CONCAT44(-(uint)((float)local_488._4_4_ <= local_1d8._4_4_) & auVar274._4_4_,
                           -(uint)((float)local_488._0_4_ <= local_1d8._0_4_) & auVar274._0_4_);
      fStack_300 = (float)(-(uint)(fStack_480 <= local_1d8._8_4_) & auVar274._8_4_);
      fStack_2fc = (float)(-(uint)(fStack_47c <= local_1d8._12_4_) & auVar274._12_4_);
      auVar88._8_4_ = fStack_300;
      auVar88._0_8_ = local_308;
      auVar88._12_4_ = fStack_2fc;
      iVar44 = movmskps(iVar44,auVar88 | _local_2f8);
      pauVar49 = (undefined1 (*) [16])CONCAT44(uVar50,iVar44);
      if (iVar44 != 0) {
        local_318 = (float)iVar51;
        fStack_314 = (float)iVar51;
        fStack_310 = (float)iVar51;
        fStack_30c = (float)iVar51;
        local_478._0_4_ =
             -(uint)(iVar51 < ((int)((-(uint)(0.3 <= ABS((float)local_478._0_4_ * fVar135 +
                                                         (float)local_548._0_4_ * fVar124 +
                                                         (float)local_538._0_4_ * fVar108)) &
                                     local_428._0_4_) << 0x1f) >> 0x1f) + 4);
        local_478._4_4_ =
             -(uint)(iVar51 < ((int)((-(uint)(0.3 <= ABS((float)local_478._4_4_ * fVar135 +
                                                         (float)local_548._4_4_ * fVar124 +
                                                         (float)local_538._4_4_ * fVar108)) &
                                     local_428._4_4_) << 0x1f) >> 0x1f) + 4);
        fStack_470 = (float)-(uint)(iVar51 < ((int)((-(uint)(0.3 <= ABS(fStack_470 * fVar135 +
                                                                        fStack_540 * fVar124 +
                                                                        fStack_530 * fVar108)) &
                                                    (uint)fStack_420) << 0x1f) >> 0x1f) + 4);
        fStack_46c = (float)-(uint)(iVar51 < ((int)((-(uint)(0.3 <= ABS(fStack_46c * fVar135 +
                                                                        fStack_53c * fVar124 +
                                                                        fStack_52c * fVar108)) &
                                                    (uint)fStack_41c) << 0x1f) >> 0x1f) + 4);
        local_2d8 = ~_local_478 & _local_2f8;
        iVar44 = movmskps(iVar44,local_2d8);
        if (iVar44 == 0) {
          fVar126 = (ray->super_RayK<1>).tfar;
          local_3f8._0_4_ = local_488._0_4_;
          local_3f8._4_4_ = local_488._4_4_;
          fStack_3f0 = fStack_480;
          fStack_3ec = fStack_47c;
        }
        else {
          local_408 = local_468 + fVar126;
          fStack_404 = fStack_464 + fVar136;
          fStack_400 = fStack_460 + fVar150;
          fStack_3fc = fStack_45c + fVar152;
          do {
            auVar237 = ~local_2d8 & _DAT_01f7a9f0 | local_2d8 & _local_3f8;
            auVar143._4_4_ = auVar237._0_4_;
            auVar143._0_4_ = auVar237._4_4_;
            auVar143._8_4_ = auVar237._12_4_;
            auVar143._12_4_ = auVar237._8_4_;
            auVar70 = minps(auVar143,auVar237);
            auVar89._0_8_ = auVar70._8_8_;
            auVar89._8_4_ = auVar70._0_4_;
            auVar89._12_4_ = auVar70._4_4_;
            auVar70 = minps(auVar89,auVar70);
            auVar90._0_8_ =
                 CONCAT44(-(uint)(auVar70._4_4_ == auVar237._4_4_) & local_2d8._4_4_,
                          -(uint)(auVar70._0_4_ == auVar237._0_4_) & local_2d8._0_4_);
            auVar90._8_4_ = -(uint)(auVar70._8_4_ == auVar237._8_4_) & local_2d8._8_4_;
            auVar90._12_4_ = -(uint)(auVar70._12_4_ == auVar237._12_4_) & local_2d8._12_4_;
            iVar44 = movmskps(iVar44,auVar90);
            auVar117 = local_2d8;
            if (iVar44 != 0) {
              auVar117._8_4_ = auVar90._8_4_;
              auVar117._0_8_ = auVar90._0_8_;
              auVar117._12_4_ = auVar90._12_4_;
            }
            uVar45 = movmskps(iVar44,auVar117);
            pRVar48 = (RayHit *)0x0;
            if (CONCAT44(uVar50,uVar45) != 0) {
              for (; (CONCAT44(uVar50,uVar45) >> (long)pRVar48 & 1) == 0;
                  pRVar48 = (RayHit *)((long)(pRVar48->super_RayK<1>).org.field_0.m128 + 1)) {
              }
            }
            *(undefined4 *)(local_2d8 + (long)pRVar48 * 4) = 0;
            fVar126 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar136 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar138 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar150 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar23._4_4_ = fStack_324;
            auVar23._0_4_ = local_328;
            auVar23._8_4_ = fStack_320;
            auVar23._12_4_ = fStack_31c;
            auVar21._4_4_ = fStack_334;
            auVar21._0_4_ = local_338;
            auVar21._8_4_ = fStack_330;
            auVar21._12_4_ = fStack_32c;
            auVar237 = minps(auVar23,auVar21);
            auVar229 = maxps(auVar23,auVar21);
            auVar19._4_4_ = fStack_344;
            auVar19._0_4_ = local_348;
            auVar19._8_4_ = fStack_340;
            auVar19._12_4_ = fStack_33c;
            auVar17._4_4_ = fStack_354;
            auVar17._0_4_ = local_358;
            auVar17._8_4_ = fStack_350;
            auVar17._12_4_ = fStack_34c;
            auVar70 = minps(auVar19,auVar17);
            auVar237 = minps(auVar237,auVar70);
            auVar70 = maxps(auVar19,auVar17);
            auVar70 = maxps(auVar229,auVar70);
            auVar175._0_8_ = auVar237._0_8_ & 0x7fffffff7fffffff;
            auVar175._8_4_ = auVar237._8_4_ & 0x7fffffff;
            auVar175._12_4_ = auVar237._12_4_ & 0x7fffffff;
            local_3e8 = auVar70._12_4_;
            auVar91._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
            auVar91._8_4_ = auVar70._8_4_ & 0x7fffffff;
            auVar91._12_4_ = ABS(local_3e8);
            auVar70 = maxps(auVar175,auVar91);
            fVar151 = auVar70._4_4_;
            if (auVar70._4_4_ <= auVar70._0_4_) {
              fVar151 = auVar70._0_4_;
            }
            auVar176._8_8_ = auVar70._8_8_;
            auVar176._0_8_ = auVar70._8_8_;
            if (auVar70._8_4_ <= fVar151) {
              auVar176._0_4_ = fVar151;
            }
            fVar183 = auVar176._0_4_ * 1.9073486e-06;
            fStack_3e4 = local_3e8;
            fStack_3e0 = local_3e8;
            fStack_3dc = local_3e8;
            fVar151 = local_108[(long)pRVar48];
            fVar152 = *(float *)(local_138 + (long)pRVar48 * 4);
            fVar184 = 0.0;
            fVar137 = 0.0;
            lVar47 = 5;
            do {
              fVar196 = SQRT(fVar138 * fVar138 + fVar136 * fVar136 + fVar126 * fVar126) *
                        1.9073486e-06 * fVar152;
              fVar198 = 1.0 - fVar151;
              fVar220 = fVar151 * 3.0;
              fVar185 = -fVar151 * fVar198 * fVar198 * 0.5;
              fVar243 = (fVar151 * fVar151 * (fVar220 + -5.0) + 2.0) * 0.5;
              fVar235 = ((fVar198 * 3.0 + -5.0) * fVar198 * fVar198 + 2.0) * 0.5;
              fVar248 = -fVar198 * fVar151 * fVar151 * 0.5;
              fVar197 = fVar185 * fStack_31c +
                        fVar243 * fStack_32c + fVar235 * fStack_33c + fVar248 * fStack_34c;
              fVar233 = (fVar151 * (fVar198 + fVar198) - fVar198 * fVar198) * 0.5;
              fVar222 = ((fVar151 + fVar151) * (fVar220 + -5.0) + fVar151 * fVar220) * 0.5;
              fVar221 = ((fVar220 + 2.0) * (fVar198 + fVar198) + fVar198 * -3.0 * fVar198) * 0.5;
              fVar198 = (fVar198 * -2.0 * fVar151 + fVar151 * fVar151) * 0.5;
              fVar244 = fVar233 * local_328 +
                        fVar222 * local_338 + fVar221 * local_348 + fVar198 * local_358;
              fVar245 = fVar233 * fStack_324 +
                        fVar222 * fStack_334 + fVar221 * fStack_344 + fVar198 * fStack_354;
              fVar246 = fVar233 * fStack_320 +
                        fVar222 * fStack_330 + fVar221 * fStack_340 + fVar198 * fStack_350;
              fVar247 = fVar233 * fStack_31c +
                        fVar222 * fStack_32c + fVar221 * fStack_33c + fVar198 * fStack_34c;
              fVar221 = fVar151 * -3.0 + 2.0;
              fVar234 = fVar151 * 9.0 + -5.0;
              fVar198 = fVar151 * -9.0 + 4.0;
              fVar220 = fVar220 + -1.0;
              fVar222 = fVar221 * local_328 +
                        fVar234 * local_338 + fVar198 * local_348 + fVar220 * local_358;
              fVar233 = fVar221 * fStack_324 +
                        fVar234 * fStack_334 + fVar198 * fStack_344 + fVar220 * fStack_354;
              fVar220 = fVar221 * fStack_320 +
                        fVar234 * fStack_330 + fVar198 * fStack_340 + fVar220 * fStack_350;
              fVar221 = (fVar152 * fVar126 + 0.0) -
                        (fVar185 * local_328 +
                        fVar243 * local_338 + fVar235 * local_348 + fVar248 * local_358);
              fVar234 = (fVar152 * fVar136 + 0.0) -
                        (fVar185 * fStack_324 +
                        fVar243 * fStack_334 + fVar235 * fStack_344 + fVar248 * fStack_354);
              fVar235 = (fVar152 * fVar138 + 0.0) -
                        (fVar185 * fStack_320 +
                        fVar243 * fStack_330 + fVar235 * fStack_340 + fVar248 * fStack_350);
              fVar185 = (fVar152 * fVar150 + 0.0) - fVar197;
              fVar198 = fVar234 * fVar234;
              fStack_380 = fVar235 * fVar235;
              fStack_37c = fVar185 * fVar185;
              local_388 = fVar198 + fVar221 * fVar221 + fStack_380;
              fStack_384 = fVar198 + fVar198 + fStack_37c;
              fStack_380 = fVar198 + fStack_380 + fStack_380;
              fStack_37c = fVar198 + fStack_37c + fStack_37c;
              local_548._4_4_ = auVar176._4_4_;
              fStack_540 = auVar176._8_4_;
              fStack_53c = auVar176._12_4_;
              local_4d8 = fVar183;
              if (fVar183 <= fVar196) {
                local_4d8 = fVar196;
              }
              fVar248 = fVar245 * fVar245 + fVar244 * fVar244 + fVar246 * fVar246;
              auVar237 = ZEXT416((uint)fVar248);
              auVar70 = rsqrtss(ZEXT416((uint)fVar248),auVar237);
              fVar196 = auVar70._0_4_;
              fVar250 = fVar196 * 1.5 - fVar196 * fVar196 * fVar248 * 0.5 * fVar196;
              fVar260 = fVar244 * fVar250;
              fVar261 = fVar245 * fVar250;
              fVar263 = fVar246 * fVar250;
              fStack_4c4 = fVar247 * fVar250;
              fVar253 = fVar220 * fVar246 + fVar233 * fVar245 + fVar222 * fVar244;
              auVar70 = rcpss(auVar237,auVar237);
              fVar196 = (2.0 - fVar248 * auVar70._0_4_) * auVar70._0_4_;
              fVar243 = fVar234 * fVar261;
              fVar251 = fVar235 * fVar263;
              fVar252 = fVar185 * fStack_4c4;
              fVar198 = fVar243 + fVar221 * fVar260 + fVar251;
              fVar259 = fVar243 + fVar243 + fVar252;
              fVar251 = fVar243 + fVar251 + fVar251;
              fVar252 = fVar243 + fVar252 + fVar252;
              uStack_4d4 = local_548._4_4_;
              uStack_4d0 = fStack_540;
              uStack_4cc = fStack_53c;
              local_4b8 = (SQRT(local_388) + 1.0) * (fVar183 / SQRT(fVar248)) +
                          SQRT(local_388) * fVar183 + local_4d8;
              fVar243 = fVar150 * fStack_4c4;
              fStack_4c0 = fVar263 * -fVar246;
              fStack_4c4 = fStack_4c4 * -fVar247;
              local_4c8 = fStack_4c0 + fVar261 * -fVar245 + fVar260 * -fVar244 +
                          fVar196 * (fVar248 * fVar220 - fVar253 * fVar246) * fVar250 * fVar235 +
                          fVar196 * (fVar248 * fVar233 - fVar253 * fVar245) * fVar250 * fVar234 +
                          fVar196 * (fVar248 * fVar222 - fVar253 * fVar244) * fVar250 * fVar221;
              fVar220 = fVar138 * fVar263 + fVar136 * fVar261 + fVar126 * fVar260;
              fVar248 = local_388 - fVar198 * fVar198;
              auVar92._0_8_ = CONCAT44(fStack_384 - fVar259 * fVar259,fVar248);
              auVar92._8_4_ = fStack_380 - fVar251 * fVar251;
              auVar92._12_4_ = fStack_37c - fVar252 * fVar252;
              fVar253 = -fVar246 * fVar235;
              fVar233 = -fVar247 * fVar185;
              fStack_4bc = fStack_4c4;
              fVar222 = (fVar253 + -fVar245 * fVar234 + -fVar244 * fVar221) - fVar198 * local_4c8;
              fVar185 = fVar150 * fVar185;
              fVar196 = (fVar138 * fVar235 + fVar136 * fVar234 + fVar126 * fVar221) -
                        fVar198 * fVar220;
              auVar118._8_4_ = auVar92._8_4_;
              auVar118._0_8_ = auVar92._0_8_;
              auVar118._12_4_ = auVar92._12_4_;
              auVar70 = rsqrtss(auVar118,auVar92);
              fVar250 = auVar70._0_4_;
              auVar144._0_4_ = fVar250 * 1.5 - fVar250 * fVar250 * fVar248 * 0.5 * fVar250;
              auVar144._4_12_ = auVar70._4_12_;
              local_4a8 = fVar152;
              fStack_4a4 = fVar151;
              fStack_4a0 = fVar184;
              fStack_49c = fVar137;
              if (fVar248 < 0.0) {
                _local_3d8 = auVar144;
                local_3c8 = fVar196;
                fStack_3c4 = fVar185;
                fStack_3c0 = fVar138 * fVar235;
                fStack_3bc = fVar185;
                local_3b8 = fVar220;
                fStack_3b4 = fVar243;
                fStack_3b0 = fVar138 * fVar263;
                fStack_3ac = fVar243;
                local_3a8 = fVar198;
                fStack_3a4 = fVar259;
                fStack_3a0 = fVar251;
                fStack_39c = fVar252;
                local_398 = fVar222;
                fStack_394 = fVar233;
                fStack_390 = fVar253;
                fStack_38c = fVar233;
                fVar248 = sqrtf(fVar248);
                pRVar48 = extraout_RAX;
                auVar144 = _local_3d8;
                fVar196 = local_3c8;
                fVar185 = fStack_3c4;
                fVar198 = local_3a8;
                fVar220 = local_3b8;
                fVar243 = fStack_3b4;
                fVar222 = local_398;
                fVar233 = fStack_394;
              }
              else {
                fVar248 = SQRT(fVar248);
              }
              fVar248 = fVar248 - fVar197;
              fVar151 = fVar222 * auVar144._0_4_ - fVar247;
              fVar196 = fVar196 * auVar144._0_4_;
              auVar267._0_8_ = CONCAT44(fVar233,fVar151) ^ 0x8000000080000000;
              auVar178._0_8_ = local_4c8._0_8_;
              auVar145._0_4_ = local_4c8 * fVar196 - fVar220 * fVar151;
              auVar267._8_4_ = -fVar233;
              auVar267._12_4_ = fVar185;
              auVar266._8_8_ = auVar267._8_8_;
              auVar266._0_8_ = CONCAT44(fVar196,fVar151) ^ 0x80000000;
              auVar145._4_4_ = auVar145._0_4_;
              auVar145._8_4_ = auVar145._0_4_;
              auVar145._12_4_ = auVar145._0_4_;
              auVar237 = divps(auVar266,auVar145);
              auVar178._8_4_ = local_4c8._4_4_;
              auVar178._12_4_ = -fVar243;
              auVar177._8_8_ = auVar178._8_8_;
              auVar177._0_8_ = CONCAT44(fVar220,local_4c8) ^ 0x8000000000000000;
              auVar70 = divps(auVar177,auVar145);
              fVar152 = local_4a8 - (fVar248 * auVar70._0_4_ + fVar198 * auVar237._0_4_);
              fVar151 = fStack_4a4 - (fVar248 * auVar70._4_4_ + fVar198 * auVar237._4_4_);
              fVar184 = fStack_4a0 - (fVar248 * auVar70._8_4_ + fVar198 * auVar237._8_4_);
              fVar137 = fStack_49c - (fVar248 * auVar70._12_4_ + fVar198 * auVar237._12_4_);
              if ((ABS(fVar198) < local_4b8) &&
                 (ABS(fVar248) < local_3e8 * 1.9073486e-06 + local_4d8 + local_4b8)) {
                fVar152 = local_2e8._0_4_ + fVar152;
                if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar152) &&
                   (((fVar126 = (ray->super_RayK<1>).tfar, fVar152 <= fVar126 && (0.0 <= fVar151))
                    && (fVar151 <= 1.0)))) {
                  auVar14._4_4_ = fStack_384;
                  auVar14._0_4_ = local_388;
                  auVar14._8_4_ = fStack_380;
                  auVar14._12_4_ = fStack_37c;
                  auVar70 = rsqrtss(auVar14,auVar14);
                  fVar136 = auVar70._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar55].ptr;
                  uVar57 = (ray->super_RayK<1>).mask;
                  pRVar48 = (RayHit *)(ulong)uVar57;
                  if ((pGVar7->mask & uVar57) != 0) {
                    fVar136 = fVar136 * 1.5 + fVar136 * fVar136 * local_388 * -0.5 * fVar136;
                    fVar221 = fVar221 * fVar136;
                    fVar234 = fVar234 * fVar136;
                    fVar235 = fVar235 * fVar136;
                    fVar136 = fVar247 * fVar221 + fVar244;
                    fVar138 = fVar247 * fVar234 + fVar245;
                    fVar150 = fVar247 * fVar235 + fVar246;
                    fVar184 = fVar234 * fVar244 - fVar245 * fVar221;
                    fVar137 = fVar235 * fVar245 - fVar246 * fVar234;
                    fVar185 = fVar221 * fVar246 - fVar244 * fVar235;
                    fVar183 = fVar138 * fVar137 - fVar185 * fVar136;
                    fVar138 = fVar150 * fVar185 - fVar184 * fVar138;
                    fVar136 = fVar136 * fVar184 - fVar137 * fVar150;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar152;
                      *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar136,fVar138);
                      (ray->Ng).field_0.field_0.z = fVar183;
                      ray->u = fVar151;
                      ray->v = 0.0;
                      ray->primID = uVar56;
                      ray->geomID = uVar55;
                      ray->instID[0] = context->user->instID[0];
                      uVar57 = context->user->instPrimID[0];
                      ray->instPrimID[0] = uVar57;
                      pRVar48 = (RayHit *)(ulong)uVar57;
                    }
                    else {
                      local_458 = CONCAT44(fVar136,fVar138);
                      fStack_450 = fVar183;
                      fStack_44c = fVar151;
                      local_448 = 0;
                      local_444 = uVar56;
                      local_440 = uVar55;
                      local_43c = context->user->instID[0];
                      local_438 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar152;
                      local_378._0_4_ = 0xffffffff;
                      local_518.geometryUserPtr = pGVar7->userPtr;
                      local_518.valid = (int *)local_378;
                      local_518.context = context->user;
                      local_518.hit = (RTCHitN *)&local_458;
                      local_518.N = 1;
                      local_518.ray = (RTCRayN *)ray;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a78d7d:
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var9)(&local_518);
                          if ((((RayK<1> *)local_518.valid)->org).field_0.m128[0] == 0.0)
                          goto LAB_00a78e29;
                        }
                        (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_518.hit;
                        (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_518.hit + 4);
                        (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_518.hit + 8);
                        *(float *)((long)local_518.ray + 0x3c) = *(float *)(local_518.hit + 0xc);
                        *(float *)((long)local_518.ray + 0x40) = *(float *)(local_518.hit + 0x10);
                        *(float *)((long)local_518.ray + 0x44) = *(float *)(local_518.hit + 0x14);
                        *(float *)((long)local_518.ray + 0x48) = *(float *)(local_518.hit + 0x18);
                        *(float *)((long)local_518.ray + 0x4c) = *(float *)(local_518.hit + 0x1c);
                        *(float *)((long)local_518.ray + 0x50) = *(float *)(local_518.hit + 0x20);
                        pRVar48 = (RayHit *)local_518.ray;
                      }
                      else {
                        (*pGVar7->intersectionFilterN)(&local_518);
                        if ((((RayK<1> *)local_518.valid)->org).field_0.m128[0] != 0.0)
                        goto LAB_00a78d7d;
LAB_00a78e29:
                        (ray->super_RayK<1>).tfar = fVar126;
                        pRVar48 = (RayHit *)local_518.valid;
                      }
                    }
                  }
                }
                break;
              }
              lVar47 = lVar47 + -1;
            } while (lVar47 != 0);
            fVar126 = (ray->super_RayK<1>).tfar;
            local_2d8._0_4_ = -(uint)(local_408 <= fVar126) & local_2d8._0_4_;
            local_2d8._4_4_ = -(uint)(fStack_404 <= fVar126) & local_2d8._4_4_;
            local_2d8._8_4_ = -(uint)(fStack_400 <= fVar126) & local_2d8._8_4_;
            local_2d8._12_4_ = -(uint)(fStack_3fc <= fVar126) & local_2d8._12_4_;
            uVar50 = (undefined4)((ulong)pRVar48 >> 0x20);
            iVar44 = movmskps((int)pRVar48,local_2d8);
          } while (iVar44 != 0);
          local_3f8._0_4_ = local_1e8._0_4_;
          local_3f8._4_4_ = local_1e8._4_4_;
          fStack_3f0 = fStack_1e0;
          fStack_3ec = fStack_1dc;
        }
        local_488._0_4_ = -(uint)((float)local_488._0_4_ + local_468 <= fVar126) & local_308._0_4_;
        local_488._4_4_ = -(uint)((float)local_488._4_4_ + fStack_464 <= fVar126) & local_308._4_4_;
        fStack_480 = (float)(-(uint)(fStack_480 + fStack_460 <= fVar126) & (uint)fStack_300);
        fStack_47c = (float)(-(uint)(fStack_47c + fStack_45c <= fVar126) & (uint)fStack_2fc);
        auVar119._0_4_ =
             -(uint)((int)local_318 <
                    ((int)((-(uint)(0.3 <= ABS((float)local_558._0_4_ * fVar108 +
                                               fVar164 * fVar124 + auVar162._0_4_ * fVar135)) &
                           local_428._0_4_) << 0x1f) >> 0x1f) + 4);
        auVar119._4_4_ =
             -(uint)((int)fStack_314 <
                    ((int)((-(uint)(0.3 <= ABS((float)local_558._4_4_ * fVar108 +
                                               fVar165 * fVar124 + auVar162._4_4_ * fVar135)) &
                           local_428._4_4_) << 0x1f) >> 0x1f) + 4);
        auVar119._8_4_ =
             -(uint)((int)fStack_310 <
                    ((int)((-(uint)(0.3 <= ABS(fStack_550 * fVar108 +
                                               fVar166 * fVar124 + auVar162._8_4_ * fVar135)) &
                           (uint)fStack_420) << 0x1f) >> 0x1f) + 4);
        auVar119._12_4_ =
             -(uint)((int)fStack_30c <
                    ((int)((-(uint)(0.3 <= ABS(fStack_54c * fVar108 +
                                               fVar127 * fVar124 + auVar162._12_4_ * fVar135)) &
                           (uint)fStack_41c) << 0x1f) >> 0x1f) + 4);
        local_378 = ~auVar119 & _local_488;
        iVar44 = movmskps(0,local_378);
        if (iVar44 != 0) {
          local_408 = local_468 + (float)local_3f8._0_4_;
          fStack_404 = fStack_464 + (float)local_3f8._4_4_;
          fStack_400 = fStack_460 + fStack_3f0;
          fStack_3fc = fStack_45c + fStack_3ec;
          fVar108 = (float)local_3f8._0_4_;
          fVar124 = (float)local_3f8._4_4_;
          fVar135 = fStack_3f0;
          fVar136 = fStack_3ec;
          do {
            uVar57 = local_378._0_4_;
            uVar58 = local_378._4_4_;
            uVar61 = local_378._8_4_;
            uVar104 = local_378._12_4_;
            auVar93._0_4_ = uVar57 & (uint)fVar108;
            auVar93._4_4_ = uVar58 & (uint)fVar124;
            auVar93._8_4_ = uVar61 & (uint)fVar135;
            auVar93._12_4_ = uVar104 & (uint)fVar136;
            auVar132._0_8_ = CONCAT44(~uVar58,~uVar57) & 0x7f8000007f800000;
            auVar132._8_4_ = ~uVar61 & 0x7f800000;
            auVar132._12_4_ = ~uVar104 & 0x7f800000;
            auVar132 = auVar132 | auVar93;
            auVar146._4_4_ = auVar132._0_4_;
            auVar146._0_4_ = auVar132._4_4_;
            auVar146._8_4_ = auVar132._12_4_;
            auVar146._12_4_ = auVar132._8_4_;
            auVar70 = minps(auVar146,auVar132);
            auVar94._0_8_ = auVar70._8_8_;
            auVar94._8_4_ = auVar70._0_4_;
            auVar94._12_4_ = auVar70._4_4_;
            auVar70 = minps(auVar94,auVar70);
            auVar95._0_8_ =
                 CONCAT44(-(uint)(auVar70._4_4_ == auVar132._4_4_) & uVar58,
                          -(uint)(auVar70._0_4_ == auVar132._0_4_) & uVar57);
            auVar95._8_4_ = -(uint)(auVar70._8_4_ == auVar132._8_4_) & uVar61;
            auVar95._12_4_ = -(uint)(auVar70._12_4_ == auVar132._12_4_) & uVar104;
            iVar44 = movmskps(iVar44,auVar95);
            auVar120 = local_378;
            if (iVar44 != 0) {
              auVar120._8_4_ = auVar95._8_4_;
              auVar120._0_8_ = auVar95._0_8_;
              auVar120._12_4_ = auVar95._12_4_;
            }
            uVar45 = movmskps(iVar44,auVar120);
            pRVar48 = (RayHit *)0x0;
            if (CONCAT44(uVar50,uVar45) != 0) {
              for (; (CONCAT44(uVar50,uVar45) >> (long)pRVar48 & 1) == 0;
                  pRVar48 = (RayHit *)((long)(pRVar48->super_RayK<1>).org.field_0.m128 + 1)) {
              }
            }
            *(undefined4 *)(local_378 + (long)pRVar48 * 4) = 0;
            fVar108 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar124 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar126 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar135 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar24._4_4_ = fStack_324;
            auVar24._0_4_ = local_328;
            auVar24._8_4_ = fStack_320;
            auVar24._12_4_ = fStack_31c;
            auVar22._4_4_ = fStack_334;
            auVar22._0_4_ = local_338;
            auVar22._8_4_ = fStack_330;
            auVar22._12_4_ = fStack_32c;
            auVar237 = minps(auVar24,auVar22);
            auVar229 = maxps(auVar24,auVar22);
            auVar20._4_4_ = fStack_344;
            auVar20._0_4_ = local_348;
            auVar20._8_4_ = fStack_340;
            auVar20._12_4_ = fStack_33c;
            auVar18._4_4_ = fStack_354;
            auVar18._0_4_ = local_358;
            auVar18._8_4_ = fStack_350;
            auVar18._12_4_ = fStack_34c;
            auVar70 = minps(auVar20,auVar18);
            auVar237 = minps(auVar237,auVar70);
            auVar70 = maxps(auVar20,auVar18);
            auVar70 = maxps(auVar229,auVar70);
            auVar179._0_8_ = auVar237._0_8_ & 0x7fffffff7fffffff;
            auVar179._8_4_ = auVar237._8_4_ & 0x7fffffff;
            auVar179._12_4_ = auVar237._12_4_ & 0x7fffffff;
            local_3e8 = auVar70._12_4_;
            auVar96._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
            auVar96._8_4_ = auVar70._8_4_ & 0x7fffffff;
            auVar96._12_4_ = ABS(local_3e8);
            auVar70 = maxps(auVar179,auVar96);
            fVar136 = auVar70._4_4_;
            if (auVar70._4_4_ <= auVar70._0_4_) {
              fVar136 = auVar70._0_4_;
            }
            auVar180._8_8_ = auVar70._8_8_;
            auVar180._0_8_ = auVar70._8_8_;
            if (auVar70._8_4_ <= fVar136) {
              auVar180._0_4_ = fVar136;
            }
            fVar150 = auVar180._0_4_ * 1.9073486e-06;
            fStack_3e4 = local_3e8;
            fStack_3e0 = local_3e8;
            fStack_3dc = local_3e8;
            fVar136 = local_118[(long)pRVar48];
            fVar138 = *(float *)(local_1d8 + (long)pRVar48 * 4);
            fVar151 = 0.0;
            fVar152 = 0.0;
            lVar47 = 5;
            do {
              fVar165 = SQRT(fVar126 * fVar126 + fVar124 * fVar124 + fVar108 * fVar108) *
                        1.9073486e-06 * fVar138;
              fVar127 = 1.0 - fVar136;
              fVar183 = fVar136 * 3.0;
              fVar164 = -fVar136 * fVar127 * fVar127 * 0.5;
              fVar198 = (fVar136 * fVar136 * (fVar183 + -5.0) + 2.0) * 0.5;
              fVar197 = ((fVar127 * 3.0 + -5.0) * fVar127 * fVar127 + 2.0) * 0.5;
              fVar234 = -fVar127 * fVar136 * fVar136 * 0.5;
              fVar166 = fVar164 * fStack_31c +
                        fVar198 * fStack_32c + fVar197 * fStack_33c + fVar234 * fStack_34c;
              fVar185 = (fVar136 * (fVar127 + fVar127) - fVar127 * fVar127) * 0.5;
              fVar137 = ((fVar136 + fVar136) * (fVar183 + -5.0) + fVar136 * fVar183) * 0.5;
              fVar184 = ((fVar183 + 2.0) * (fVar127 + fVar127) + fVar127 * -3.0 * fVar127) * 0.5;
              fVar127 = (fVar127 * -2.0 * fVar136 + fVar136 * fVar136) * 0.5;
              fVar220 = fVar185 * local_328 +
                        fVar137 * local_338 + fVar184 * local_348 + fVar127 * local_358;
              fVar221 = fVar185 * fStack_324 +
                        fVar137 * fStack_334 + fVar184 * fStack_344 + fVar127 * fStack_354;
              fVar222 = fVar185 * fStack_320 +
                        fVar137 * fStack_330 + fVar184 * fStack_340 + fVar127 * fStack_350;
              fVar233 = fVar185 * fStack_31c +
                        fVar137 * fStack_32c + fVar184 * fStack_33c + fVar127 * fStack_34c;
              fVar184 = fVar136 * -3.0 + 2.0;
              fVar196 = fVar136 * 9.0 + -5.0;
              fVar127 = fVar136 * -9.0 + 4.0;
              fVar183 = fVar183 + -1.0;
              fVar137 = fVar184 * local_328 +
                        fVar196 * local_338 + fVar127 * local_348 + fVar183 * local_358;
              fVar185 = fVar184 * fStack_324 +
                        fVar196 * fStack_334 + fVar127 * fStack_344 + fVar183 * fStack_354;
              fVar183 = fVar184 * fStack_320 +
                        fVar196 * fStack_330 + fVar127 * fStack_340 + fVar183 * fStack_350;
              fVar184 = (fVar138 * fVar108 + 0.0) -
                        (fVar164 * local_328 +
                        fVar198 * local_338 + fVar197 * local_348 + fVar234 * local_358);
              fVar196 = (fVar138 * fVar124 + 0.0) -
                        (fVar164 * fStack_324 +
                        fVar198 * fStack_334 + fVar197 * fStack_344 + fVar234 * fStack_354);
              fVar197 = (fVar138 * fVar126 + 0.0) -
                        (fVar164 * fStack_320 +
                        fVar198 * fStack_330 + fVar197 * fStack_340 + fVar234 * fStack_350);
              fVar164 = (fVar138 * fVar135 + 0.0) - fVar166;
              fVar127 = fVar196 * fVar196;
              fStack_380 = fVar197 * fVar197;
              fStack_37c = fVar164 * fVar164;
              local_388 = fVar127 + fVar184 * fVar184 + fStack_380;
              fStack_384 = fVar127 + fVar127 + fStack_37c;
              fStack_380 = fVar127 + fStack_380 + fStack_380;
              fStack_37c = fVar127 + fStack_37c + fStack_37c;
              local_548._4_4_ = auVar180._4_4_;
              fStack_540 = auVar180._8_4_;
              fStack_53c = auVar180._12_4_;
              local_4d8 = fVar150;
              if (fVar150 <= fVar165) {
                local_4d8 = fVar165;
              }
              fVar234 = fVar221 * fVar221 + fVar220 * fVar220 + fVar222 * fVar222;
              auVar237 = ZEXT416((uint)fVar234);
              auVar70 = rsqrtss(ZEXT416((uint)fVar234),auVar237);
              fVar165 = auVar70._0_4_;
              fVar235 = fVar165 * 1.5 - fVar165 * fVar165 * fVar234 * 0.5 * fVar165;
              fVar247 = fVar220 * fVar235;
              fVar248 = fVar221 * fVar235;
              fVar250 = fVar222 * fVar235;
              fStack_4c4 = fVar233 * fVar235;
              fVar245 = fVar183 * fVar222 + fVar185 * fVar221 + fVar137 * fVar220;
              auVar70 = rcpss(auVar237,auVar237);
              fVar165 = (2.0 - fVar234 * auVar70._0_4_) * auVar70._0_4_;
              fVar198 = fVar196 * fVar248;
              fVar243 = fVar197 * fVar250;
              fVar244 = fVar164 * fStack_4c4;
              fVar127 = fVar198 + fVar184 * fVar247 + fVar243;
              fVar246 = fVar198 + fVar198 + fVar244;
              fVar243 = fVar198 + fVar243 + fVar243;
              fVar244 = fVar198 + fVar244 + fVar244;
              uStack_4d4 = local_548._4_4_;
              uStack_4d0 = fStack_540;
              uStack_4cc = fStack_53c;
              local_4b8 = (SQRT(local_388) + 1.0) * (fVar150 / SQRT(fVar234)) +
                          SQRT(local_388) * fVar150 + local_4d8;
              fVar198 = fVar135 * fStack_4c4;
              fStack_4c0 = fVar250 * -fVar222;
              fStack_4c4 = fStack_4c4 * -fVar233;
              local_4c8 = fStack_4c0 + fVar248 * -fVar221 + fVar247 * -fVar220 +
                          fVar165 * (fVar234 * fVar183 - fVar245 * fVar222) * fVar235 * fVar197 +
                          fVar165 * (fVar234 * fVar185 - fVar245 * fVar221) * fVar235 * fVar196 +
                          fVar165 * (fVar234 * fVar137 - fVar245 * fVar220) * fVar235 * fVar184;
              fVar183 = fVar126 * fVar250 + fVar124 * fVar248 + fVar108 * fVar247;
              fVar234 = local_388 - fVar127 * fVar127;
              auVar97._0_8_ = CONCAT44(fStack_384 - fVar246 * fVar246,fVar234);
              auVar97._8_4_ = fStack_380 - fVar243 * fVar243;
              auVar97._12_4_ = fStack_37c - fVar244 * fVar244;
              fVar245 = -fVar222 * fVar197;
              fVar185 = -fVar233 * fVar164;
              fStack_4bc = fStack_4c4;
              fVar137 = (fVar245 + -fVar221 * fVar196 + -fVar220 * fVar184) - fVar127 * local_4c8;
              fVar164 = fVar135 * fVar164;
              fVar165 = (fVar126 * fVar197 + fVar124 * fVar196 + fVar108 * fVar184) -
                        fVar127 * fVar183;
              auVar121._8_4_ = auVar97._8_4_;
              auVar121._0_8_ = auVar97._0_8_;
              auVar121._12_4_ = auVar97._12_4_;
              auVar70 = rsqrtss(auVar121,auVar97);
              fVar235 = auVar70._0_4_;
              auVar147._0_4_ = fVar235 * 1.5 - fVar235 * fVar235 * fVar234 * 0.5 * fVar235;
              auVar147._4_12_ = auVar70._4_12_;
              local_4a8 = fVar138;
              fStack_4a4 = fVar136;
              fStack_4a0 = fVar151;
              fStack_49c = fVar152;
              if (fVar234 < 0.0) {
                _local_3d8 = auVar147;
                local_3c8 = fVar165;
                fStack_3c4 = fVar164;
                fStack_3c0 = fVar126 * fVar197;
                fStack_3bc = fVar164;
                local_3b8 = fVar183;
                fStack_3b4 = fVar198;
                fStack_3b0 = fVar126 * fVar250;
                fStack_3ac = fVar198;
                local_3a8 = fVar127;
                fStack_3a4 = fVar246;
                fStack_3a0 = fVar243;
                fStack_39c = fVar244;
                local_398 = fVar137;
                fStack_394 = fVar185;
                fStack_390 = fVar245;
                fStack_38c = fVar185;
                fVar234 = sqrtf(fVar234);
                pRVar48 = extraout_RAX_00;
                auVar147 = _local_3d8;
                fVar165 = local_3c8;
                fVar164 = fStack_3c4;
                fVar127 = local_3a8;
                fVar183 = local_3b8;
                fVar198 = fStack_3b4;
                fVar137 = local_398;
                fVar185 = fStack_394;
              }
              else {
                fVar234 = SQRT(fVar234);
              }
              fVar234 = fVar234 - fVar166;
              fVar136 = fVar137 * auVar147._0_4_ - fVar233;
              fVar165 = fVar165 * auVar147._0_4_;
              auVar269._0_8_ = CONCAT44(fVar185,fVar136) ^ 0x8000000080000000;
              auVar182._0_8_ = local_4c8._0_8_;
              auVar148._0_4_ = local_4c8 * fVar165 - fVar183 * fVar136;
              auVar269._8_4_ = -fVar185;
              auVar269._12_4_ = fVar164;
              auVar268._8_8_ = auVar269._8_8_;
              auVar268._0_8_ = CONCAT44(fVar165,fVar136) ^ 0x80000000;
              auVar148._4_4_ = auVar148._0_4_;
              auVar148._8_4_ = auVar148._0_4_;
              auVar148._12_4_ = auVar148._0_4_;
              auVar237 = divps(auVar268,auVar148);
              auVar182._8_4_ = local_4c8._4_4_;
              auVar182._12_4_ = -fVar198;
              auVar181._8_8_ = auVar182._8_8_;
              auVar181._0_8_ = CONCAT44(fVar183,local_4c8) ^ 0x8000000000000000;
              auVar70 = divps(auVar181,auVar148);
              fVar138 = local_4a8 - (fVar234 * auVar70._0_4_ + fVar127 * auVar237._0_4_);
              fVar136 = fStack_4a4 - (fVar234 * auVar70._4_4_ + fVar127 * auVar237._4_4_);
              fVar151 = fStack_4a0 - (fVar234 * auVar70._8_4_ + fVar127 * auVar237._8_4_);
              fVar152 = fStack_49c - (fVar234 * auVar70._12_4_ + fVar127 * auVar237._12_4_);
              if ((ABS(fVar127) < local_4b8) &&
                 (ABS(fVar234) < local_3e8 * 1.9073486e-06 + local_4d8 + local_4b8)) {
                fVar138 = local_2e8._0_4_ + fVar138;
                if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar138) &&
                   (((fVar108 = (ray->super_RayK<1>).tfar, fVar138 <= fVar108 && (0.0 <= fVar136))
                    && (fVar136 <= 1.0)))) {
                  auVar15._4_4_ = fStack_384;
                  auVar15._0_4_ = local_388;
                  auVar15._8_4_ = fStack_380;
                  auVar15._12_4_ = fStack_37c;
                  auVar70 = rsqrtss(auVar15,auVar15);
                  fVar124 = auVar70._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar55].ptr;
                  uVar57 = (ray->super_RayK<1>).mask;
                  pRVar48 = (RayHit *)(ulong)uVar57;
                  if ((pGVar7->mask & uVar57) != 0) {
                    fVar124 = fVar124 * 1.5 + fVar124 * fVar124 * local_388 * -0.5 * fVar124;
                    fVar184 = fVar184 * fVar124;
                    fVar196 = fVar196 * fVar124;
                    fVar197 = fVar197 * fVar124;
                    fVar124 = fVar233 * fVar184 + fVar220;
                    fVar126 = fVar233 * fVar196 + fVar221;
                    fVar135 = fVar233 * fVar197 + fVar222;
                    fVar151 = fVar196 * fVar220 - fVar221 * fVar184;
                    fVar152 = fVar197 * fVar221 - fVar222 * fVar196;
                    fVar164 = fVar184 * fVar222 - fVar220 * fVar197;
                    fVar150 = fVar126 * fVar152 - fVar164 * fVar124;
                    fVar126 = fVar135 * fVar164 - fVar151 * fVar126;
                    fVar124 = fVar124 * fVar151 - fVar152 * fVar135;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar138;
                      *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar124,fVar126);
                      (ray->Ng).field_0.field_0.z = fVar150;
                      ray->u = fVar136;
                      ray->v = 0.0;
                      ray->primID = uVar56;
                      ray->geomID = uVar55;
                      ray->instID[0] = context->user->instID[0];
                      uVar57 = context->user->instPrimID[0];
                      ray->instPrimID[0] = uVar57;
                      pRVar48 = (RayHit *)(ulong)uVar57;
                    }
                    else {
                      local_458 = CONCAT44(fVar124,fVar126);
                      fStack_450 = fVar150;
                      fStack_44c = fVar136;
                      local_448 = 0;
                      local_444 = uVar56;
                      local_440 = uVar55;
                      local_43c = context->user->instID[0];
                      local_438 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar138;
                      local_48c = 0xffffffff;
                      local_518.geometryUserPtr = pGVar7->userPtr;
                      local_518.valid = &local_48c;
                      local_518.context = context->user;
                      local_518.hit = (RTCHitN *)&local_458;
                      local_518.N = 1;
                      local_518.ray = (RTCRayN *)ray;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a7985a:
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var9)(&local_518);
                          if ((((RayK<1> *)local_518.valid)->org).field_0.m128[0] == 0.0)
                          goto LAB_00a79906;
                        }
                        (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_518.hit;
                        (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_518.hit + 4);
                        (((Vec3f *)((long)local_518.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_518.hit + 8);
                        *(float *)((long)local_518.ray + 0x3c) = *(float *)(local_518.hit + 0xc);
                        *(float *)((long)local_518.ray + 0x40) = *(float *)(local_518.hit + 0x10);
                        *(float *)((long)local_518.ray + 0x44) = *(float *)(local_518.hit + 0x14);
                        *(float *)((long)local_518.ray + 0x48) = *(float *)(local_518.hit + 0x18);
                        *(float *)((long)local_518.ray + 0x4c) = *(float *)(local_518.hit + 0x1c);
                        *(float *)((long)local_518.ray + 0x50) = *(float *)(local_518.hit + 0x20);
                        pRVar48 = (RayHit *)local_518.ray;
                      }
                      else {
                        (*pGVar7->intersectionFilterN)(&local_518);
                        if ((((RayK<1> *)local_518.valid)->org).field_0.m128[0] != 0.0)
                        goto LAB_00a7985a;
LAB_00a79906:
                        (ray->super_RayK<1>).tfar = fVar108;
                        pRVar48 = (RayHit *)local_518.valid;
                      }
                    }
                  }
                }
                break;
              }
              lVar47 = lVar47 + -1;
            } while (lVar47 != 0);
            fVar126 = (ray->super_RayK<1>).tfar;
            local_378._0_4_ = -(uint)(local_408 <= fVar126) & local_378._0_4_;
            local_378._4_4_ = -(uint)(fStack_404 <= fVar126) & local_378._4_4_;
            local_378._8_4_ = -(uint)(fStack_400 <= fVar126) & local_378._8_4_;
            local_378._12_4_ = -(uint)(fStack_3fc <= fVar126) & local_378._12_4_;
            uVar50 = (undefined4)((ulong)pRVar48 >> 0x20);
            iVar44 = movmskps((int)pRVar48,local_378);
            fVar108 = (float)local_3f8._0_4_;
            fVar124 = (float)local_3f8._4_4_;
            fVar135 = fStack_3f0;
            fVar136 = fStack_3ec;
          } while (iVar44 != 0);
          iVar44 = 0;
          local_3f8._0_4_ = local_1e8._0_4_;
          local_3f8._4_4_ = local_1e8._4_4_;
          fStack_3f0 = fStack_1e0;
          fStack_3ec = fStack_1dc;
        }
        auVar163._0_4_ =
             local_478._0_4_ & local_2f8._0_4_ &
             -(uint)(local_468 + (float)local_138._0_4_ <= fVar126);
        auVar163._4_4_ =
             local_478._4_4_ & local_2f8._4_4_ &
             -(uint)(fStack_464 + (float)local_138._4_4_ <= fVar126);
        auVar163._8_4_ =
             (uint)fStack_470 & (uint)fStack_2f0 & -(uint)(fStack_460 + fStack_130 <= fVar126);
        auVar163._12_4_ =
             (uint)fStack_46c & (uint)fStack_2ec & -(uint)(fStack_45c + fStack_12c <= fVar126);
        auVar98._0_4_ =
             auVar119._0_4_ & local_488._0_4_ &
             -(uint)(local_468 + (float)local_3f8._0_4_ <= fVar126);
        auVar98._4_4_ =
             auVar119._4_4_ & local_488._4_4_ &
             -(uint)(fStack_464 + (float)local_3f8._4_4_ <= fVar126);
        auVar98._8_4_ =
             auVar119._8_4_ & (uint)fStack_480 & -(uint)(fStack_460 + fStack_3f0 <= fVar126);
        auVar98._12_4_ =
             auVar119._12_4_ & (uint)fStack_47c & -(uint)(fStack_45c + fStack_3ec <= fVar126);
        uVar57 = movmskps(iVar44,auVar98 | auVar163);
        pauVar49 = (undefined1 (*) [16])(ulong)uVar57;
        if (uVar57 != 0) {
          pauVar49 = (undefined1 (*) [16])(uVar52 * 0x30);
          *(undefined1 (*) [16])(auStack_f8 + (long)pauVar49) = auVar98 | auVar163;
          auStack_e8[uVar52 * 0xc] =
               ~auVar163._0_4_ & local_3f8._0_4_ | local_138._0_4_ & auVar163._0_4_;
          *(uint *)(&stack0x0000000c + (long)pauVar49[-0xf]) =
               ~auVar163._4_4_ & local_3f8._4_4_ | local_138._4_4_ & auVar163._4_4_;
          *(uint *)(&stack0x00000000 + (long)pauVar49[-0xe]) =
               ~auVar163._8_4_ & (uint)fStack_3f0 | (uint)fStack_130 & auVar163._8_4_;
          *(uint *)(&stack0x00000004 + (long)pauVar49[-0xe]) =
               ~auVar163._12_4_ & (uint)fStack_3ec | (uint)fStack_12c & auVar163._12_4_;
          (&uStack_d8)[uVar52 * 6] = CONCAT44(fStack_184,local_188);
          aiStack_d0[uVar52 * 0xc] = iVar51 + 1;
          iVar53 = iVar53 + 1;
        }
      }
    }
    fVar108 = (ray->super_RayK<1>).tfar;
    if (iVar53 == 0) break;
    uVar58 = -iVar53;
    pauVar49 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar53 - 1) * 0x30);
    uVar57 = uVar58;
    while( true ) {
      local_518.valid._0_4_ =
           -(uint)(local_468 + *(float *)pauVar49[1] <= fVar108) & *(uint *)*pauVar49;
      local_518.valid._4_4_ =
           -(uint)(fStack_464 + *(float *)(pauVar49[1] + 4) <= fVar108) & *(uint *)(*pauVar49 + 4);
      local_518.geometryUserPtr._0_4_ =
           -(uint)(fStack_460 + *(float *)(pauVar49[1] + 8) <= fVar108) & *(uint *)(*pauVar49 + 8);
      local_518.geometryUserPtr._4_4_ =
           -(uint)(fStack_45c + *(float *)(pauVar49[1] + 0xc) <= fVar108) &
           *(uint *)(*pauVar49 + 0xc);
      iVar51 = movmskps(uVar57,(undefined1  [16])local_518._0_16_);
      if (iVar51 != 0) break;
      pauVar49 = pauVar49 + -3;
      uVar58 = uVar58 + 1;
      uVar57 = 0;
      if (uVar58 == 0) goto LAB_00a79ac2;
    }
    auVar133._0_4_ = (uint)*(float *)pauVar49[1] & (uint)local_518.valid;
    auVar133._4_4_ = (uint)*(float *)(pauVar49[1] + 4) & local_518.valid._4_4_;
    auVar133._8_4_ = (uint)*(float *)(pauVar49[1] + 8) & (uint)local_518.geometryUserPtr;
    auVar133._12_4_ = (uint)*(float *)(pauVar49[1] + 0xc) & local_518.geometryUserPtr._4_4_;
    auVar149._0_8_ = CONCAT44(~local_518.valid._4_4_,~(uint)local_518.valid) & 0x7f8000007f800000;
    auVar149._8_4_ = ~(uint)local_518.geometryUserPtr & 0x7f800000;
    auVar149._12_4_ = ~local_518.geometryUserPtr._4_4_ & 0x7f800000;
    auVar149 = auVar149 | auVar133;
    auVar134._4_4_ = auVar149._0_4_;
    auVar134._0_4_ = auVar149._4_4_;
    auVar134._8_4_ = auVar149._12_4_;
    auVar134._12_4_ = auVar149._8_4_;
    auVar70 = minps(auVar134,auVar149);
    auVar99._0_8_ = auVar70._8_8_;
    auVar99._8_4_ = auVar70._0_4_;
    auVar99._12_4_ = auVar70._4_4_;
    auVar70 = minps(auVar99,auVar70);
    auVar100._0_8_ =
         CONCAT44(-(uint)(auVar70._4_4_ == auVar149._4_4_) & local_518.valid._4_4_,
                  -(uint)(auVar70._0_4_ == auVar149._0_4_) & (uint)local_518.valid);
    auVar100._8_4_ = -(uint)(auVar70._8_4_ == auVar149._8_4_) & (uint)local_518.geometryUserPtr;
    auVar100._12_4_ = -(uint)(auVar70._12_4_ == auVar149._12_4_) & local_518.geometryUserPtr._4_4_;
    iVar44 = movmskps(iVar51,auVar100);
    auVar122 = (undefined1  [16])local_518._0_16_;
    if (iVar44 != 0) {
      auVar122._8_4_ = auVar100._8_4_;
      auVar122._0_8_ = auVar100._0_8_;
      auVar122._12_4_ = auVar100._12_4_;
    }
    uVar254 = *(undefined8 *)pauVar49[2];
    iVar51 = *(int *)(pauVar49[2] + 8);
    uVar57 = movmskps(iVar44,auVar122);
    lVar47 = 0;
    if (uVar57 != 0) {
      for (; (uVar57 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
      }
    }
    *(undefined4 *)((long)&local_518.valid + lVar47 * 4) = 0;
    *pauVar49 = (undefined1  [16])local_518._0_16_;
    iVar44 = movmskps((int)pauVar49,(undefined1  [16])local_518._0_16_);
    uVar46 = CONCAT44((int)((ulong)pauVar49 >> 0x20),iVar44);
    uVar57 = ~uVar58;
    if (iVar44 != 0) {
      uVar57 = -uVar58;
    }
    uVar52 = (ulong)uVar57;
    fVar108 = (float)uVar254;
    fVar124 = (float)((ulong)uVar254 >> 0x20) - fVar108;
    local_458 = CONCAT44(fVar124 * 0.33333334 + fVar108,fVar124 * 0.0 + fVar108);
    fStack_450 = fVar124 * 0.6666667 + fVar108;
    fStack_44c = fVar124 * 1.0 + fVar108;
    local_188 = *(float *)((long)&local_458 + lVar47 * 4);
    fStack_184 = *(float *)((long)&local_458 + lVar47 * 4 + 4);
  } while( true );
LAB_00a79ac2:
  auVar123._4_4_ = -(uint)(fStack_1c4 <= fVar108);
  auVar123._0_4_ = -(uint)(local_1c8 <= fVar108);
  auVar123._8_4_ = -(uint)(fStack_1c0 <= fVar108);
  auVar123._12_4_ = -(uint)(fStack_1bc <= fVar108);
  uVar55 = movmskps((int)pauVar49,auVar123);
  uVar55 = (uint)uVar54 & uVar55;
  if (uVar55 == 0) {
    return;
  }
  goto LAB_00a771fe;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }